

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  long lVar65;
  int iVar66;
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  uint uVar72;
  long lVar73;
  ulong uVar74;
  long lVar75;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Geometry *pGVar76;
  uint uVar77;
  byte bVar78;
  ulong uVar79;
  ulong uVar80;
  float fVar81;
  float fVar82;
  float fVar127;
  float fVar129;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar85 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar86 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar133;
  undefined4 uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar149;
  float fVar150;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar154;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar170 [32];
  float fVar176;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar206 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  
  PVar12 = prim[1];
  uVar79 = (ulong)(byte)PVar12;
  fVar154 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar151 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar85 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar164 = fVar154 * auVar85._0_4_;
  fVar133 = fVar154 * auVar151._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar84);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar5);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar101 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar7);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar94 = vcvtdq2ps_avx(auVar97);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar79 + 6);
  auVar92 = vpmovsxbd_avx2(auVar8);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar74 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar74 + uVar79 + 6);
  auVar95 = vpmovsxbd_avx2(auVar10);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar69 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar89 = vpmovsxbd_avx2(auVar11);
  auVar96 = vcvtdq2ps_avx(auVar89);
  auVar197._4_4_ = fVar133;
  auVar197._0_4_ = fVar133;
  auVar197._8_4_ = fVar133;
  auVar197._12_4_ = fVar133;
  auVar197._16_4_ = fVar133;
  auVar197._20_4_ = fVar133;
  auVar197._24_4_ = fVar133;
  auVar197._28_4_ = fVar133;
  auVar201._8_4_ = 1;
  auVar201._0_8_ = 0x100000001;
  auVar201._12_4_ = 1;
  auVar201._16_4_ = 1;
  auVar201._20_4_ = 1;
  auVar201._24_4_ = 1;
  auVar201._28_4_ = 1;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar207 = ZEXT3264(auVar87);
  auVar99 = ZEXT1632(CONCAT412(fVar154 * auVar151._12_4_,
                               CONCAT48(fVar154 * auVar151._8_4_,
                                        CONCAT44(fVar154 * auVar151._4_4_,fVar133))));
  auVar98 = vpermps_avx2(auVar201,auVar99);
  auVar88 = vpermps_avx512vl(auVar87,auVar99);
  fVar133 = auVar88._0_4_;
  fVar149 = auVar88._4_4_;
  auVar99._4_4_ = fVar149 * auVar102._4_4_;
  auVar99._0_4_ = fVar133 * auVar102._0_4_;
  fVar150 = auVar88._8_4_;
  auVar99._8_4_ = fVar150 * auVar102._8_4_;
  fVar165 = auVar88._12_4_;
  auVar99._12_4_ = fVar165 * auVar102._12_4_;
  fVar174 = auVar88._16_4_;
  auVar99._16_4_ = fVar174 * auVar102._16_4_;
  fVar175 = auVar88._20_4_;
  auVar99._20_4_ = fVar175 * auVar102._20_4_;
  fVar176 = auVar88._24_4_;
  auVar99._24_4_ = fVar176 * auVar102._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar92._4_4_ * fVar149;
  auVar97._0_4_ = auVar92._0_4_ * fVar133;
  auVar97._8_4_ = auVar92._8_4_ * fVar150;
  auVar97._12_4_ = auVar92._12_4_ * fVar165;
  auVar97._16_4_ = auVar92._16_4_ * fVar174;
  auVar97._20_4_ = auVar92._20_4_ * fVar175;
  auVar97._24_4_ = auVar92._24_4_ * fVar176;
  auVar97._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar96._4_4_ * fVar149;
  auVar89._0_4_ = auVar96._0_4_ * fVar133;
  auVar89._8_4_ = auVar96._8_4_ * fVar150;
  auVar89._12_4_ = auVar96._12_4_ * fVar165;
  auVar89._16_4_ = auVar96._16_4_ * fVar174;
  auVar89._20_4_ = auVar96._20_4_ * fVar175;
  auVar89._24_4_ = auVar96._24_4_ * fVar176;
  auVar89._28_4_ = auVar88._28_4_;
  auVar83 = vfmadd231ps_fma(auVar99,auVar98,auVar91);
  auVar84 = vfmadd231ps_fma(auVar97,auVar98,auVar94);
  auVar5 = vfmadd231ps_fma(auVar89,auVar95,auVar98);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar197,auVar93);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar197,auVar101);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar100,auVar197);
  auVar198._4_4_ = fVar164;
  auVar198._0_4_ = fVar164;
  auVar198._8_4_ = fVar164;
  auVar198._12_4_ = fVar164;
  auVar198._16_4_ = fVar164;
  auVar198._20_4_ = fVar164;
  auVar198._24_4_ = fVar164;
  auVar198._28_4_ = fVar164;
  auVar89 = ZEXT1632(CONCAT412(fVar154 * auVar85._12_4_,
                               CONCAT48(fVar154 * auVar85._8_4_,
                                        CONCAT44(fVar154 * auVar85._4_4_,fVar164))));
  auVar97 = vpermps_avx2(auVar201,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  fVar154 = auVar89._0_4_;
  fVar133 = auVar89._4_4_;
  auVar98._4_4_ = fVar133 * auVar102._4_4_;
  auVar98._0_4_ = fVar154 * auVar102._0_4_;
  fVar149 = auVar89._8_4_;
  auVar98._8_4_ = fVar149 * auVar102._8_4_;
  fVar150 = auVar89._12_4_;
  auVar98._12_4_ = fVar150 * auVar102._12_4_;
  fVar165 = auVar89._16_4_;
  auVar98._16_4_ = fVar165 * auVar102._16_4_;
  fVar174 = auVar89._20_4_;
  auVar98._20_4_ = fVar174 * auVar102._20_4_;
  fVar175 = auVar89._24_4_;
  auVar98._24_4_ = fVar175 * auVar102._24_4_;
  auVar98._28_4_ = 1;
  auVar87._4_4_ = auVar92._4_4_ * fVar133;
  auVar87._0_4_ = auVar92._0_4_ * fVar154;
  auVar87._8_4_ = auVar92._8_4_ * fVar149;
  auVar87._12_4_ = auVar92._12_4_ * fVar150;
  auVar87._16_4_ = auVar92._16_4_ * fVar165;
  auVar87._20_4_ = auVar92._20_4_ * fVar174;
  auVar87._24_4_ = auVar92._24_4_ * fVar175;
  auVar87._28_4_ = auVar102._28_4_;
  auVar92._4_4_ = auVar96._4_4_ * fVar133;
  auVar92._0_4_ = auVar96._0_4_ * fVar154;
  auVar92._8_4_ = auVar96._8_4_ * fVar149;
  auVar92._12_4_ = auVar96._12_4_ * fVar150;
  auVar92._16_4_ = auVar96._16_4_ * fVar165;
  auVar92._20_4_ = auVar96._20_4_ * fVar174;
  auVar92._24_4_ = auVar96._24_4_ * fVar175;
  auVar92._28_4_ = auVar89._28_4_;
  auVar6 = vfmadd231ps_fma(auVar98,auVar97,auVar91);
  auVar7 = vfmadd231ps_fma(auVar87,auVar97,auVar94);
  auVar8 = vfmadd231ps_fma(auVar92,auVar97,auVar95);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar198,auVar93);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar198,auVar101);
  auVar189._8_4_ = 0x7fffffff;
  auVar189._0_8_ = 0x7fffffff7fffffff;
  auVar189._12_4_ = 0x7fffffff;
  auVar189._16_4_ = 0x7fffffff;
  auVar189._20_4_ = 0x7fffffff;
  auVar189._24_4_ = 0x7fffffff;
  auVar189._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar198,auVar100);
  auVar93 = vandps_avx(ZEXT1632(auVar83),auVar189);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar187._16_4_ = 0x219392ef;
  auVar187._20_4_ = 0x219392ef;
  auVar187._24_4_ = 0x219392ef;
  auVar187._28_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar93,auVar187,1);
  bVar17 = (bool)((byte)uVar74 & 1);
  auVar88._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._0_4_;
  bVar17 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._4_4_;
  bVar17 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._8_4_;
  bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar84),auVar189);
  uVar74 = vcmpps_avx512vl(auVar93,auVar187,1);
  bVar17 = (bool)((byte)uVar74 & 1);
  auVar90._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar84._0_4_;
  bVar17 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar84._4_4_;
  bVar17 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar84._8_4_;
  bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar84._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar5),auVar189);
  uVar74 = vcmpps_avx512vl(auVar93,auVar187,1);
  bVar17 = (bool)((byte)uVar74 & 1);
  auVar93._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar5._0_4_;
  bVar17 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar5._4_4_;
  bVar17 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar5._8_4_;
  bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar5._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar88);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = 0x3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar188._16_4_ = 0x3f800000;
  auVar188._20_4_ = 0x3f800000;
  auVar188._24_4_ = 0x3f800000;
  auVar188._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar88,auVar91,auVar188);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar90);
  auVar84 = vfnmadd213ps_fma(auVar90,auVar91,auVar188);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar93);
  auVar5 = vfnmadd213ps_fma(auVar93,auVar91,auVar188);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar91,auVar91);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar100._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar100._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar100._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar100._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * 0.0;
  auVar100._20_4_ = auVar93._20_4_ * 0.0;
  auVar100._24_4_ = auVar93._24_4_ * 0.0;
  auVar100._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar92 = vpbroadcastd_avx512vl();
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar161._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar161._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar161._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar161._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar161._16_4_ = auVar93._16_4_ * 0.0;
  auVar161._20_4_ = auVar93._20_4_ * 0.0;
  auVar161._24_4_ = auVar93._24_4_ * 0.0;
  auVar161._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar12 * 0x10 + uVar79 * -2 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar7));
  auVar95._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar95._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar95._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar95._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar95._16_4_ = auVar93._16_4_ * 0.0;
  auVar95._20_4_ = auVar93._20_4_ * 0.0;
  auVar95._24_4_ = auVar93._24_4_ * 0.0;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar91);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar7));
  auVar152._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar152._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar152._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar152._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar152._16_4_ = auVar93._16_4_ * 0.0;
  auVar152._20_4_ = auVar93._20_4_ * 0.0;
  auVar152._24_4_ = auVar93._24_4_ * 0.0;
  auVar152._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 + uVar79 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar8));
  auVar96._4_4_ = auVar93._4_4_ * auVar5._4_4_;
  auVar96._0_4_ = auVar93._0_4_ * auVar5._0_4_;
  auVar96._8_4_ = auVar93._8_4_ * auVar5._8_4_;
  auVar96._12_4_ = auVar93._12_4_ * auVar5._12_4_;
  auVar96._16_4_ = auVar93._16_4_ * 0.0;
  auVar96._20_4_ = auVar93._20_4_ * 0.0;
  auVar96._24_4_ = auVar93._24_4_ * 0.0;
  auVar96._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar8));
  auVar139._0_4_ = auVar5._0_4_ * auVar93._0_4_;
  auVar139._4_4_ = auVar5._4_4_ * auVar93._4_4_;
  auVar139._8_4_ = auVar5._8_4_ * auVar93._8_4_;
  auVar139._12_4_ = auVar5._12_4_ * auVar93._12_4_;
  auVar139._16_4_ = auVar93._16_4_ * 0.0;
  auVar139._20_4_ = auVar93._20_4_ * 0.0;
  auVar139._24_4_ = auVar93._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar100,auVar161);
  auVar91 = vpminsd_avx2(auVar95,auVar152);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91 = vpminsd_avx2(auVar96,auVar139);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar102._4_4_ = uVar134;
  auVar102._0_4_ = uVar134;
  auVar102._8_4_ = uVar134;
  auVar102._12_4_ = uVar134;
  auVar102._16_4_ = uVar134;
  auVar102._20_4_ = uVar134;
  auVar102._24_4_ = uVar134;
  auVar102._28_4_ = uVar134;
  auVar91 = vmaxps_avx512vl(auVar91,auVar102);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar91);
  auVar93 = vpmaxsd_avx2(auVar100,auVar161);
  auVar91 = vpmaxsd_avx2(auVar95,auVar152);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar91 = vpmaxsd_avx2(auVar96,auVar139);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar101._4_4_ = uVar134;
  auVar101._0_4_ = uVar134;
  auVar101._8_4_ = uVar134;
  auVar101._12_4_ = uVar134;
  auVar101._16_4_ = uVar134;
  auVar101._20_4_ = uVar134;
  auVar101._24_4_ = uVar134;
  auVar101._28_4_ = uVar134;
  auVar91 = vminps_avx512vl(auVar91,auVar101);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar94);
  uVar24 = vpcmpgtd_avx512vl(auVar92,_DAT_01fe9900);
  uVar23 = vcmpps_avx512vl(local_80,auVar93,2);
  if ((byte)((byte)uVar23 & (byte)uVar24) != 0) {
    uVar74 = (ulong)(byte)((byte)uVar23 & (byte)uVar24);
    local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar209 = ZEXT1664(auVar83);
    do {
      lVar75 = 0;
      for (uVar69 = uVar74; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar75 = lVar75 + 1;
      }
      uVar77 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar75 * 4 + 6);
      pGVar76 = (context->scene->geometries).items[uVar77].ptr;
      uVar69 = (ulong)*(uint *)(*(long *)&pGVar76->field_0x58 +
                               (ulong)uVar13 *
                               pGVar76[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar70 = (long)pGVar76[1].intersectionFilterN * uVar69;
      lVar75 = *(long *)&pGVar76[1].time_range.upper;
      local_5b0 = *(undefined1 (*) [16])(lVar75 + lVar70);
      lVar73 = (long)pGVar76[1].intersectionFilterN * (uVar69 + 1);
      _local_5c0 = *(undefined1 (*) [16])(lVar75 + lVar73);
      iVar14 = (int)pGVar76[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      lVar65 = (long)iVar14 * 0x44;
      auVar85._8_4_ = 0xbeaaaaab;
      auVar85._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar85._12_4_ = 0xbeaaaaab;
      local_5a0 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar76[2].intersectionFilterN +
                                    uVar69 * (long)pGVar76[2].pointQueryFunc),local_5b0,auVar85);
      local_5d0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar76[2].intersectionFilterN +
                                   (long)pGVar76[2].pointQueryFunc * (uVar69 + 1)),_local_5c0,
                                  auVar85);
      auVar5 = vsubps_avx(local_5b0,auVar83);
      uVar134 = auVar5._0_4_;
      auVar155._4_4_ = uVar134;
      auVar155._0_4_ = uVar134;
      auVar155._8_4_ = uVar134;
      auVar155._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar5,auVar5,0x55);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar154 = pre->ray_space[k].vz.field_0.m128[0];
      fVar133 = pre->ray_space[k].vz.field_0.m128[1];
      fVar149 = pre->ray_space[k].vz.field_0.m128[2];
      fVar150 = pre->ray_space[k].vz.field_0.m128[3];
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar194._0_4_ = fVar154 * auVar5._0_4_;
      auVar194._4_4_ = fVar133 * auVar5._4_4_;
      auVar194._8_4_ = fVar149 * auVar5._8_4_;
      auVar194._12_4_ = fVar150 * auVar5._12_4_;
      auVar84 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar4,auVar84);
      auVar6 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar155);
      auVar5 = vsubps_avx(local_5a0,auVar83);
      uVar134 = auVar5._0_4_;
      auVar156._4_4_ = uVar134;
      auVar156._0_4_ = uVar134;
      auVar156._8_4_ = uVar134;
      auVar156._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar195._0_4_ = fVar154 * auVar5._0_4_;
      auVar195._4_4_ = fVar133 * auVar5._4_4_;
      auVar195._8_4_ = fVar149 * auVar5._8_4_;
      auVar195._12_4_ = fVar150 * auVar5._12_4_;
      auVar84 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar4,auVar84);
      auVar7 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar156);
      auVar5 = vsubps_avx(local_5d0,auVar83);
      uVar134 = auVar5._0_4_;
      auVar86._4_4_ = uVar134;
      auVar86._0_4_ = uVar134;
      auVar86._8_4_ = uVar134;
      auVar86._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar196._0_4_ = fVar154 * auVar5._0_4_;
      auVar196._4_4_ = fVar133 * auVar5._4_4_;
      auVar196._8_4_ = fVar149 * auVar5._8_4_;
      auVar196._12_4_ = fVar150 * auVar5._12_4_;
      auVar84 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar4,auVar84);
      auVar5 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar86);
      auVar84 = vsubps_avx(_local_5c0,auVar83);
      uVar134 = auVar84._0_4_;
      auVar151._4_4_ = uVar134;
      auVar151._0_4_ = uVar134;
      auVar151._8_4_ = uVar134;
      auVar151._12_4_ = uVar134;
      auVar83 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar200._0_4_ = fVar154 * auVar84._0_4_;
      auVar200._4_4_ = fVar133 * auVar84._4_4_;
      auVar200._8_4_ = fVar149 * auVar84._8_4_;
      auVar200._12_4_ = fVar150 * auVar84._12_4_;
      auVar83 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar4,auVar83);
      auVar8 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar3,auVar151);
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar65);
      uVar134 = auVar6._0_4_;
      local_2e0._4_4_ = uVar134;
      local_2e0._0_4_ = uVar134;
      local_2e0._8_4_ = uVar134;
      local_2e0._12_4_ = uVar134;
      local_2e0._16_4_ = uVar134;
      local_2e0._20_4_ = uVar134;
      local_2e0._24_4_ = uVar134;
      local_2e0._28_4_ = uVar134;
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x484);
      auVar140._8_4_ = 1;
      auVar140._0_8_ = 0x100000001;
      auVar140._12_4_ = 1;
      auVar140._16_4_ = 1;
      auVar140._20_4_ = 1;
      auVar140._24_4_ = 1;
      auVar140._28_4_ = 1;
      local_300 = vpermps_avx2(auVar140,ZEXT1632(auVar6));
      local_320 = vbroadcastss_avx512vl(auVar7);
      local_340 = vpermps_avx512vl(auVar140,ZEXT1632(auVar7));
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar5);
      local_380 = vpermps_avx512vl(auVar140,ZEXT1632(auVar5));
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0xd8c);
      uVar134 = auVar8._0_4_;
      local_3a0._4_4_ = uVar134;
      local_3a0._0_4_ = uVar134;
      fStack_398 = (float)uVar134;
      fStack_394 = (float)uVar134;
      fStack_390 = (float)uVar134;
      fStack_38c = (float)uVar134;
      fStack_388 = (float)uVar134;
      register0x0000139c = uVar134;
      _local_3c0 = vpermps_avx512vl(auVar140,ZEXT1632(auVar8));
      auVar94 = vmulps_avx512vl(_local_3a0,auVar101);
      auVar92 = vmulps_avx512vl(_local_3c0,auVar101);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_360);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar102,local_380);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_320);
      auVar95 = vfmadd231ps_avx512vl(auVar92,auVar91,local_340);
      auVar9 = vfmadd231ps_fma(auVar94,auVar93,local_2e0);
      auVar186 = ZEXT1664(auVar9);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar65);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x484);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x908);
      auVar10 = vfmadd231ps_fma(auVar95,auVar93,local_300);
      auVar181 = ZEXT1664(auVar10);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0xd8c);
      auVar96 = vmulps_avx512vl(_local_3a0,auVar95);
      auVar97 = vmulps_avx512vl(_local_3c0,auVar95);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_360);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_380);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_320);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_340);
      auVar11 = vfmadd231ps_fma(auVar96,auVar94,local_2e0);
      auVar190 = ZEXT1664(auVar11);
      auVar151 = vfmadd231ps_fma(auVar97,auVar94,local_300);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar9));
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar151),ZEXT1632(auVar10));
      auVar89 = vmulps_avx512vl(ZEXT1632(auVar10),auVar96);
      auVar98 = vmulps_avx512vl(ZEXT1632(auVar9),auVar97);
      auVar89 = vsubps_avx512vl(auVar89,auVar98);
      auVar83 = vshufps_avx(local_5a0,local_5a0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar83);
      auVar83 = vshufps_avx(local_5d0,local_5d0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar83);
      local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar75 + 0xc + lVar73)));
      auVar98 = vmulps_avx512vl(local_e0,auVar101);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,local_a0);
      local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar75 + 0xc + lVar70)));
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_100);
      auVar99 = vmulps_avx512vl(local_e0,auVar95);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_100);
      auVar87 = vmulps_avx512vl(auVar97,auVar97);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,auVar96);
      auVar88 = vmaxps_avx512vl(auVar98,auVar99);
      auVar88 = vmulps_avx512vl(auVar88,auVar88);
      auVar87 = vmulps_avx512vl(auVar88,auVar87);
      auVar89 = vmulps_avx512vl(auVar89,auVar89);
      uVar23 = vcmpps_avx512vl(auVar89,auVar87,2);
      auVar83 = vinsertps_avx512f(auVar6,local_100._0_16_,0x30);
      auVar155 = auVar209._0_16_;
      auVar84 = vandps_avx512vl(auVar83,auVar155);
      auVar83 = vblendps_avx(auVar7,local_5a0,8);
      auVar83 = vandps_avx512vl(auVar83,auVar155);
      auVar84 = vmaxps_avx512vl(auVar84,auVar83);
      auVar83 = vblendps_avx(auVar5,local_5d0,8);
      auVar85 = vandps_avx512vl(auVar83,auVar155);
      auVar83 = vinsertps_avx512f(auVar8,local_e0._0_16_,0x30);
      auVar83 = vandps_avx512vl(auVar83,auVar155);
      auVar83 = vmaxps_avx512vl(auVar85,auVar83);
      auVar83 = vmaxps_avx(auVar84,auVar83);
      auVar84 = vmovshdup_avx(auVar83);
      auVar84 = vmaxss_avx(auVar84,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar84);
      local_560 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar14);
      auVar192._0_4_ = local_560._0_4_;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar192._16_4_ = auVar192._0_4_;
      auVar192._20_4_ = auVar192._0_4_;
      auVar192._24_4_ = auVar192._0_4_;
      auVar192._28_4_ = auVar192._0_4_;
      uVar24 = vcmpps_avx512vl(auVar192,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar23 & (byte)uVar24;
      fVar154 = auVar83._0_4_ * 4.7683716e-07;
      local_520._0_16_ = ZEXT416((uint)fVar154);
      auVar89 = auVar207._0_32_;
      local_4e0 = vpermps_avx512vl(auVar89,ZEXT1632(auVar6));
      auVar208 = ZEXT3264(local_4e0);
      local_160 = vpermps_avx512vl(auVar89,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar89,ZEXT1632(auVar5));
      local_1a0 = vpermps_avx512vl(auVar89,ZEXT1632(auVar8));
      local_480 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_47c = 0;
      uStack_478 = 0;
      uStack_474 = 0;
      if (bVar78 != 0) {
        in_ZMM25 = ZEXT3264(local_1a0);
        auVar95 = vmulps_avx512vl(local_1a0,auVar95);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_180,auVar95);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar100);
        auVar92 = vfmadd213ps_avx512vl(auVar94,local_4e0,auVar92);
        auVar101 = vmulps_avx512vl(local_1a0,auVar101);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar101);
        auVar100 = vfmadd213ps_avx512vl(auVar91,local_160,auVar102);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1210);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1694);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1f9c);
        auVar100 = vfmadd213ps_avx512vl(auVar93,local_4e0,auVar100);
        auVar93 = vmulps_avx512vl(_local_3a0,auVar94);
        auVar95 = vmulps_avx512vl(_local_3c0,auVar94);
        auVar94 = vmulps_avx512vl(local_1a0,auVar94);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,local_360);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_380);
        auVar101 = vfmadd231ps_avx512vl(auVar94,local_180,auVar101);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,local_320);
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar102,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar101,local_160,auVar102);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar91,local_2e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_300);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1210);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1f9c);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_4e0,auVar91);
        auVar91 = vmulps_avx512vl(_local_3a0,auVar101);
        auVar87 = vmulps_avx512vl(_local_3c0,auVar101);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar209 = ZEXT1664(auVar83);
        auVar101 = vmulps_avx512vl(local_1a0,auVar101);
        auVar88 = vfmadd231ps_avx512vl(auVar91,auVar102,local_360);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_380);
        auVar102 = vfmadd231ps_avx512vl(auVar101,local_180,auVar102);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1694);
        auVar101 = vfmadd231ps_avx512vl(auVar88,auVar91,local_320);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_340);
        auVar91 = vfmadd231ps_avx512vl(auVar102,local_160,auVar91);
        auVar102 = vfmadd231ps_avx512vl(auVar101,auVar93,local_2e0);
        auVar101 = vfmadd231ps_avx512vl(auVar87,auVar93,local_300);
        auVar91 = vfmadd231ps_avx512vl(auVar91,local_4e0,auVar93);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar89,auVar87);
        vandps_avx512vl(auVar94,auVar87);
        auVar93 = vmaxps_avx(auVar87,auVar87);
        vandps_avx512vl(auVar95,auVar87);
        auVar93 = vmaxps_avx(auVar93,auVar87);
        auVar199._4_4_ = fVar154;
        auVar199._0_4_ = fVar154;
        auVar199._8_4_ = fVar154;
        auVar199._12_4_ = fVar154;
        auVar199._16_4_ = fVar154;
        auVar199._20_4_ = fVar154;
        auVar199._24_4_ = fVar154;
        auVar199._28_4_ = fVar154;
        uVar69 = vcmpps_avx512vl(auVar93,auVar199,1);
        bVar17 = (bool)((byte)uVar69 & 1);
        auVar103._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar89._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar89._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar89._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar89._12_4_);
        bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar89._16_4_);
        bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar89._20_4_);
        bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar89._24_4_);
        bVar17 = SUB81(uVar69 >> 7,0);
        auVar103._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar89._28_4_;
        bVar17 = (bool)((byte)uVar69 & 1);
        auVar104._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar94._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar94._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar94._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar94._12_4_);
        bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar94._16_4_);
        bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar94._20_4_);
        bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar94._24_4_);
        bVar17 = SUB81(uVar69 >> 7,0);
        auVar104._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar94._28_4_;
        vandps_avx512vl(auVar102,auVar87);
        vandps_avx512vl(auVar101,auVar87);
        auVar93 = vmaxps_avx(auVar104,auVar104);
        vandps_avx512vl(auVar91,auVar87);
        auVar93 = vmaxps_avx(auVar93,auVar104);
        uVar69 = vcmpps_avx512vl(auVar93,auVar199,1);
        bVar17 = (bool)((byte)uVar69 & 1);
        auVar105._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar102._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar102._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar102._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar102._12_4_);
        bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar102._16_4_);
        bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar102._20_4_);
        bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar102._24_4_);
        bVar17 = SUB81(uVar69 >> 7,0);
        auVar105._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar102._28_4_;
        bVar17 = (bool)((byte)uVar69 & 1);
        auVar106._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar101._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar101._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar101._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar101._12_4_);
        bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar101._16_4_);
        bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar101._20_4_);
        bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar101._24_4_);
        bVar17 = SUB81(uVar69 >> 7,0);
        auVar106._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar101._28_4_;
        auVar86 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
        auVar93 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar86));
        auVar83 = vfmadd231ps_fma(auVar93,auVar104,auVar104);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar83),auVar102);
        fVar154 = auVar93._0_4_;
        fVar133 = auVar93._4_4_;
        fVar149 = auVar93._8_4_;
        fVar150 = auVar93._12_4_;
        fVar165 = auVar93._16_4_;
        fVar174 = auVar93._20_4_;
        fVar175 = auVar93._24_4_;
        auVar32._4_4_ = fVar133 * fVar133 * fVar133 * auVar101._4_4_;
        auVar32._0_4_ = fVar154 * fVar154 * fVar154 * auVar101._0_4_;
        auVar32._8_4_ = fVar149 * fVar149 * fVar149 * auVar101._8_4_;
        auVar32._12_4_ = fVar150 * fVar150 * fVar150 * auVar101._12_4_;
        auVar32._16_4_ = fVar165 * fVar165 * fVar165 * auVar101._16_4_;
        auVar32._20_4_ = fVar174 * fVar174 * fVar174 * auVar101._20_4_;
        auVar32._24_4_ = fVar175 * fVar175 * fVar175 * auVar101._24_4_;
        auVar32._28_4_ = auVar91._28_4_;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar32,auVar91,auVar93);
        auVar33._4_4_ = auVar104._4_4_ * auVar93._4_4_;
        auVar33._0_4_ = auVar104._0_4_ * auVar93._0_4_;
        auVar33._8_4_ = auVar104._8_4_ * auVar93._8_4_;
        auVar33._12_4_ = auVar104._12_4_ * auVar93._12_4_;
        auVar33._16_4_ = auVar104._16_4_ * auVar93._16_4_;
        auVar33._20_4_ = auVar104._20_4_ * auVar93._20_4_;
        auVar33._24_4_ = auVar104._24_4_ * auVar93._24_4_;
        auVar33._28_4_ = auVar101._28_4_;
        auVar34._4_4_ = auVar93._4_4_ * -auVar103._4_4_;
        auVar34._0_4_ = auVar93._0_4_ * -auVar103._0_4_;
        auVar34._8_4_ = auVar93._8_4_ * -auVar103._8_4_;
        auVar34._12_4_ = auVar93._12_4_ * -auVar103._12_4_;
        auVar34._16_4_ = auVar93._16_4_ * -auVar103._16_4_;
        auVar34._20_4_ = auVar93._20_4_ * -auVar103._20_4_;
        auVar34._24_4_ = auVar93._24_4_ * -auVar103._24_4_;
        auVar34._28_4_ = auVar104._28_4_;
        auVar101 = vmulps_avx512vl(auVar93,ZEXT1632(auVar86));
        auVar95 = ZEXT1632(auVar86);
        auVar94 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar95);
        auVar83 = vfmadd231ps_fma(auVar94,auVar106,auVar106);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        auVar102 = vmulps_avx512vl(ZEXT1632(auVar83),auVar102);
        fVar154 = auVar94._0_4_;
        fVar133 = auVar94._4_4_;
        fVar149 = auVar94._8_4_;
        fVar150 = auVar94._12_4_;
        fVar165 = auVar94._16_4_;
        fVar174 = auVar94._20_4_;
        fVar175 = auVar94._24_4_;
        auVar35._4_4_ = fVar133 * fVar133 * fVar133 * auVar102._4_4_;
        auVar35._0_4_ = fVar154 * fVar154 * fVar154 * auVar102._0_4_;
        auVar35._8_4_ = fVar149 * fVar149 * fVar149 * auVar102._8_4_;
        auVar35._12_4_ = fVar150 * fVar150 * fVar150 * auVar102._12_4_;
        auVar35._16_4_ = fVar165 * fVar165 * fVar165 * auVar102._16_4_;
        auVar35._20_4_ = fVar174 * fVar174 * fVar174 * auVar102._20_4_;
        auVar35._24_4_ = fVar175 * fVar175 * fVar175 * auVar102._24_4_;
        auVar35._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd231ps_avx512vl(auVar35,auVar91,auVar94);
        auVar36._4_4_ = auVar106._4_4_ * auVar93._4_4_;
        auVar36._0_4_ = auVar106._0_4_ * auVar93._0_4_;
        auVar36._8_4_ = auVar106._8_4_ * auVar93._8_4_;
        auVar36._12_4_ = auVar106._12_4_ * auVar93._12_4_;
        auVar36._16_4_ = auVar106._16_4_ * auVar93._16_4_;
        auVar36._20_4_ = auVar106._20_4_ * auVar93._20_4_;
        auVar36._24_4_ = auVar106._24_4_ * auVar93._24_4_;
        auVar36._28_4_ = auVar102._28_4_;
        auVar37._4_4_ = auVar93._4_4_ * -auVar105._4_4_;
        auVar37._0_4_ = auVar93._0_4_ * -auVar105._0_4_;
        auVar37._8_4_ = auVar93._8_4_ * -auVar105._8_4_;
        auVar37._12_4_ = auVar93._12_4_ * -auVar105._12_4_;
        auVar37._16_4_ = auVar93._16_4_ * -auVar105._16_4_;
        auVar37._20_4_ = auVar93._20_4_ * -auVar105._20_4_;
        auVar37._24_4_ = auVar93._24_4_ * -auVar105._24_4_;
        auVar37._28_4_ = auVar94._28_4_;
        auVar93 = vmulps_avx512vl(auVar93,auVar95);
        auVar83 = vfmadd213ps_fma(auVar33,auVar98,ZEXT1632(auVar9));
        auVar84 = vfmadd213ps_fma(auVar34,auVar98,ZEXT1632(auVar10));
        auVar102 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar100);
        auVar94 = vfmadd213ps_avx512vl(auVar36,auVar99,ZEXT1632(auVar11));
        auVar85 = vfnmadd213ps_fma(auVar33,auVar98,ZEXT1632(auVar9));
        auVar5 = vfmadd213ps_fma(auVar37,auVar99,ZEXT1632(auVar151));
        auVar10 = vfnmadd213ps_fma(auVar34,auVar98,ZEXT1632(auVar10));
        auVar6 = vfmadd213ps_fma(auVar93,auVar99,auVar92);
        auVar155 = vfnmadd231ps_fma(auVar100,auVar98,auVar101);
        auVar11 = vfnmadd213ps_fma(auVar36,auVar99,ZEXT1632(auVar11));
        auVar151 = vfnmadd213ps_fma(auVar37,auVar99,ZEXT1632(auVar151));
        auVar156 = vfnmadd231ps_fma(auVar92,auVar99,auVar93);
        auVar92 = vsubps_avx512vl(auVar94,ZEXT1632(auVar85));
        auVar93 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar10));
        auVar91 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar155));
        auVar38._4_4_ = auVar93._4_4_ * auVar155._4_4_;
        auVar38._0_4_ = auVar93._0_4_ * auVar155._0_4_;
        auVar38._8_4_ = auVar93._8_4_ * auVar155._8_4_;
        auVar38._12_4_ = auVar93._12_4_ * auVar155._12_4_;
        auVar38._16_4_ = auVar93._16_4_ * 0.0;
        auVar38._20_4_ = auVar93._20_4_ * 0.0;
        auVar38._24_4_ = auVar93._24_4_ * 0.0;
        auVar38._28_4_ = auVar101._28_4_;
        auVar7 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar10),auVar91);
        auVar39._4_4_ = auVar91._4_4_ * auVar85._4_4_;
        auVar39._0_4_ = auVar91._0_4_ * auVar85._0_4_;
        auVar39._8_4_ = auVar91._8_4_ * auVar85._8_4_;
        auVar39._12_4_ = auVar91._12_4_ * auVar85._12_4_;
        auVar39._16_4_ = auVar91._16_4_ * 0.0;
        auVar39._20_4_ = auVar91._20_4_ * 0.0;
        auVar39._24_4_ = auVar91._24_4_ * 0.0;
        auVar39._28_4_ = auVar91._28_4_;
        auVar8 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar155),auVar92);
        auVar40._4_4_ = auVar10._4_4_ * auVar92._4_4_;
        auVar40._0_4_ = auVar10._0_4_ * auVar92._0_4_;
        auVar40._8_4_ = auVar10._8_4_ * auVar92._8_4_;
        auVar40._12_4_ = auVar10._12_4_ * auVar92._12_4_;
        auVar40._16_4_ = auVar92._16_4_ * 0.0;
        auVar40._20_4_ = auVar92._20_4_ * 0.0;
        auVar40._24_4_ = auVar92._24_4_ * 0.0;
        auVar40._28_4_ = auVar92._28_4_;
        auVar9 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar85),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar95,ZEXT1632(auVar8));
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,ZEXT1632(auVar7));
        auVar87 = ZEXT1632(auVar86);
        uVar69 = vcmpps_avx512vl(auVar93,auVar87,2);
        bVar68 = (byte)uVar69;
        fVar81 = (float)((uint)(bVar68 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar11._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar127 = (float)((uint)bVar17 * auVar83._4_4_ | (uint)!bVar17 * auVar11._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar129 = (float)((uint)bVar17 * auVar83._8_4_ | (uint)!bVar17 * auVar11._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar131 = (float)((uint)bVar17 * auVar83._12_4_ | (uint)!bVar17 * auVar11._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar81))));
        fVar82 = (float)((uint)(bVar68 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar151._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar128 = (float)((uint)bVar17 * auVar84._4_4_ | (uint)!bVar17 * auVar151._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar130 = (float)((uint)bVar17 * auVar84._8_4_ | (uint)!bVar17 * auVar151._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar132 = (float)((uint)bVar17 * auVar84._12_4_ | (uint)!bVar17 * auVar151._12_4_);
        auVar95 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar82))));
        auVar107._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar68 & 1) * auVar156._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar156._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar156._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar156._12_4_);
        fVar133 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar102._16_4_);
        auVar107._16_4_ = fVar133;
        fVar154 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar102._20_4_);
        auVar107._20_4_ = fVar154;
        fVar149 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar102._24_4_);
        auVar107._24_4_ = fVar149;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar102._28_4_;
        auVar107._28_4_ = iVar1;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar85),auVar94);
        auVar108._0_4_ =
             (uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar83._0_4_;
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar83._4_4_;
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar83._8_4_;
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar83._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_;
        auVar108._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar5));
        auVar109._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar7._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar7._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar7._12_4_);
        fVar150 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
        auVar109._16_4_ = fVar150;
        fVar165 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
        auVar109._20_4_ = fVar165;
        fVar174 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
        auVar109._24_4_ = fVar174;
        auVar109._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar155),ZEXT1632(auVar6));
        auVar110._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_)
        ;
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar84._4_4_);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar84._8_4_);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar84._12_4_);
        fVar175 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
        auVar110._16_4_ = fVar175;
        fVar176 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
        auVar110._20_4_ = fVar176;
        fVar164 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
        auVar110._24_4_ = fVar164;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
        auVar110._28_4_ = iVar2;
        auVar111._0_4_ =
             (uint)(bVar68 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar17 * (int)auVar85._4_4_ | (uint)!bVar17 * auVar94._4_4_;
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar17 * (int)auVar85._8_4_ | (uint)!bVar17 * auVar94._8_4_;
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar17 * (int)auVar85._12_4_ | (uint)!bVar17 * auVar94._12_4_;
        auVar111._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_;
        auVar111._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_;
        auVar111._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_;
        auVar111._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar94._28_4_;
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar96 = vsubps_avx512vl(auVar111,auVar100);
        auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar10._12_4_ |
                                                (uint)!bVar21 * auVar5._12_4_,
                                                CONCAT48((uint)bVar19 * (int)auVar10._8_4_ |
                                                         (uint)!bVar19 * auVar5._8_4_,
                                                         CONCAT44((uint)bVar17 * (int)auVar10._4_4_
                                                                  | (uint)!bVar17 * auVar5._4_4_,
                                                                  (uint)(bVar68 & 1) *
                                                                  (int)auVar10._0_4_ |
                                                                  (uint)!(bool)(bVar68 & 1) *
                                                                  auVar5._0_4_)))),auVar95);
        auVar186 = ZEXT3264(auVar91);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar155._12_4_ |
                                                 (uint)!bVar22 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar20 * (int)auVar155._8_4_ |
                                                          (uint)!bVar20 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar18 *
                                                                   (int)auVar155._4_4_ |
                                                                   (uint)!bVar18 * auVar6._4_4_,
                                                                   (uint)(bVar68 & 1) *
                                                                   (int)auVar155._0_4_ |
                                                                   (uint)!(bool)(bVar68 & 1) *
                                                                   auVar6._0_4_)))),auVar107);
        auVar101 = vsubps_avx(auVar100,auVar108);
        auVar190 = ZEXT3264(auVar101);
        auVar94 = vsubps_avx(auVar95,auVar109);
        auVar92 = vsubps_avx(auVar107,auVar110);
        auVar41._4_4_ = auVar102._4_4_ * fVar127;
        auVar41._0_4_ = auVar102._0_4_ * fVar81;
        auVar41._8_4_ = auVar102._8_4_ * fVar129;
        auVar41._12_4_ = auVar102._12_4_ * fVar131;
        auVar41._16_4_ = auVar102._16_4_ * 0.0;
        auVar41._20_4_ = auVar102._20_4_ * 0.0;
        auVar41._24_4_ = auVar102._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar41,auVar107,auVar96);
        auVar170._0_4_ = fVar82 * auVar96._0_4_;
        auVar170._4_4_ = fVar128 * auVar96._4_4_;
        auVar170._8_4_ = fVar130 * auVar96._8_4_;
        auVar170._12_4_ = fVar132 * auVar96._12_4_;
        auVar170._16_4_ = auVar96._16_4_ * 0.0;
        auVar170._20_4_ = auVar96._20_4_ * 0.0;
        auVar170._24_4_ = auVar96._24_4_ * 0.0;
        auVar170._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar170,auVar100,auVar91);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar87,ZEXT1632(auVar83));
        auVar177._0_4_ = auVar91._0_4_ * auVar107._0_4_;
        auVar177._4_4_ = auVar91._4_4_ * auVar107._4_4_;
        auVar177._8_4_ = auVar91._8_4_ * auVar107._8_4_;
        auVar177._12_4_ = auVar91._12_4_ * auVar107._12_4_;
        auVar177._16_4_ = auVar91._16_4_ * fVar133;
        auVar177._20_4_ = auVar91._20_4_ * fVar154;
        auVar177._24_4_ = auVar91._24_4_ * fVar149;
        auVar177._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar177,auVar95,auVar102);
        auVar97 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar83));
        auVar93 = vmulps_avx512vl(auVar92,auVar108);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar101,auVar110);
        auVar42._4_4_ = auVar94._4_4_ * auVar110._4_4_;
        auVar42._0_4_ = auVar94._0_4_ * auVar110._0_4_;
        auVar42._8_4_ = auVar94._8_4_ * auVar110._8_4_;
        auVar42._12_4_ = auVar94._12_4_ * auVar110._12_4_;
        auVar42._16_4_ = auVar94._16_4_ * fVar175;
        auVar42._20_4_ = auVar94._20_4_ * fVar176;
        auVar42._24_4_ = auVar94._24_4_ * fVar164;
        auVar42._28_4_ = iVar2;
        auVar83 = vfmsub231ps_fma(auVar42,auVar109,auVar92);
        auVar178._0_4_ = auVar109._0_4_ * auVar101._0_4_;
        auVar178._4_4_ = auVar109._4_4_ * auVar101._4_4_;
        auVar178._8_4_ = auVar109._8_4_ * auVar101._8_4_;
        auVar178._12_4_ = auVar109._12_4_ * auVar101._12_4_;
        auVar178._16_4_ = fVar150 * auVar101._16_4_;
        auVar178._20_4_ = fVar165 * auVar101._20_4_;
        auVar178._24_4_ = fVar174 * auVar101._24_4_;
        auVar178._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar178,auVar94,auVar108);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar87,auVar93);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar83));
        auVar181 = ZEXT3264(auVar89);
        auVar93 = vmaxps_avx(auVar97,auVar89);
        uVar23 = vcmpps_avx512vl(auVar93,auVar87,2);
        bVar78 = bVar78 & (byte)uVar23;
        if (bVar78 != 0) {
          uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar202._4_4_ = uVar134;
          auVar202._0_4_ = uVar134;
          auVar202._8_4_ = uVar134;
          auVar202._12_4_ = uVar134;
          auVar202._16_4_ = uVar134;
          auVar202._20_4_ = uVar134;
          auVar202._24_4_ = uVar134;
          auVar202._28_4_ = uVar134;
          auVar205 = ZEXT3264(auVar202);
          auVar43._4_4_ = auVar92._4_4_ * auVar91._4_4_;
          auVar43._0_4_ = auVar92._0_4_ * auVar91._0_4_;
          auVar43._8_4_ = auVar92._8_4_ * auVar91._8_4_;
          auVar43._12_4_ = auVar92._12_4_ * auVar91._12_4_;
          auVar43._16_4_ = auVar92._16_4_ * auVar91._16_4_;
          auVar43._20_4_ = auVar92._20_4_ * auVar91._20_4_;
          auVar43._24_4_ = auVar92._24_4_ * auVar91._24_4_;
          auVar43._28_4_ = auVar93._28_4_;
          auVar6 = vfmsub231ps_fma(auVar43,auVar94,auVar102);
          auVar44._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar44._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar44._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar44._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar44._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar44._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar44._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar44._28_4_ = auVar102._28_4_;
          auVar5 = vfmsub231ps_fma(auVar44,auVar96,auVar92);
          auVar45._4_4_ = auVar94._4_4_ * auVar96._4_4_;
          auVar45._0_4_ = auVar94._0_4_ * auVar96._0_4_;
          auVar45._8_4_ = auVar94._8_4_ * auVar96._8_4_;
          auVar45._12_4_ = auVar94._12_4_ * auVar96._12_4_;
          auVar45._16_4_ = auVar94._16_4_ * auVar96._16_4_;
          auVar45._20_4_ = auVar94._20_4_ * auVar96._20_4_;
          auVar45._24_4_ = auVar94._24_4_ * auVar96._24_4_;
          auVar45._28_4_ = auVar94._28_4_;
          auVar7 = vfmsub231ps_fma(auVar45,auVar101,auVar91);
          auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar5),ZEXT1632(auVar7));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar6),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar93 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = 0x3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar91 = vfnmadd213ps_avx512vl(auVar93,ZEXT1632(auVar84),auVar25);
          auVar83 = vfmadd132ps_fma(auVar91,auVar93,auVar93);
          auVar186 = ZEXT1664(auVar83);
          auVar46._4_4_ = auVar7._4_4_ * auVar107._4_4_;
          auVar46._0_4_ = auVar7._0_4_ * auVar107._0_4_;
          auVar46._8_4_ = auVar7._8_4_ * auVar107._8_4_;
          auVar46._12_4_ = auVar7._12_4_ * auVar107._12_4_;
          auVar46._16_4_ = fVar133 * 0.0;
          auVar46._20_4_ = fVar154 * 0.0;
          auVar46._24_4_ = fVar149 * 0.0;
          auVar46._28_4_ = iVar1;
          auVar5 = vfmadd231ps_fma(auVar46,auVar95,ZEXT1632(auVar5));
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar100,ZEXT1632(auVar6));
          fVar154 = auVar83._0_4_;
          fVar133 = auVar83._4_4_;
          fVar149 = auVar83._8_4_;
          fVar150 = auVar83._12_4_;
          local_280._28_4_ = auVar93._28_4_;
          local_280._0_28_ =
               ZEXT1628(CONCAT412(auVar5._12_4_ * fVar150,
                                  CONCAT48(auVar5._8_4_ * fVar149,
                                           CONCAT44(auVar5._4_4_ * fVar133,auVar5._0_4_ * fVar154)))
                       );
          auVar190 = ZEXT3264(local_280);
          auVar141._4_4_ = local_480;
          auVar141._0_4_ = local_480;
          auVar141._8_4_ = local_480;
          auVar141._12_4_ = local_480;
          auVar141._16_4_ = local_480;
          auVar141._20_4_ = local_480;
          auVar141._24_4_ = local_480;
          auVar141._28_4_ = local_480;
          uVar23 = vcmpps_avx512vl(local_280,auVar202,2);
          uVar24 = vcmpps_avx512vl(auVar141,local_280,2);
          bVar78 = (byte)uVar23 & (byte)uVar24 & bVar78;
          if (bVar78 != 0) {
            uVar79 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar79 = bVar78 & uVar79;
            if ((char)uVar79 != '\0') {
              fVar165 = auVar97._0_4_ * fVar154;
              fVar174 = auVar97._4_4_ * fVar133;
              auVar47._4_4_ = fVar174;
              auVar47._0_4_ = fVar165;
              fVar175 = auVar97._8_4_ * fVar149;
              auVar47._8_4_ = fVar175;
              fVar176 = auVar97._12_4_ * fVar150;
              auVar47._12_4_ = fVar176;
              fVar164 = auVar97._16_4_ * 0.0;
              auVar47._16_4_ = fVar164;
              fVar81 = auVar97._20_4_ * 0.0;
              auVar47._20_4_ = fVar81;
              fVar82 = auVar97._24_4_ * 0.0;
              auVar47._24_4_ = fVar82;
              auVar47._28_4_ = auVar97._28_4_;
              auVar142._8_4_ = 0x3f800000;
              auVar142._0_8_ = 0x3f8000003f800000;
              auVar142._12_4_ = 0x3f800000;
              auVar142._16_4_ = 0x3f800000;
              auVar142._20_4_ = 0x3f800000;
              auVar142._24_4_ = 0x3f800000;
              auVar142._28_4_ = 0x3f800000;
              auVar93 = vsubps_avx(auVar142,auVar47);
              local_2c0._0_4_ =
                   (float)((uint)(bVar68 & 1) * (int)fVar165 |
                          (uint)!(bool)(bVar68 & 1) * auVar93._0_4_);
              bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar17 * (int)fVar174 | (uint)!bVar17 * auVar93._4_4_)
              ;
              bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar17 * (int)fVar175 | (uint)!bVar17 * auVar93._8_4_)
              ;
              bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar17 * (int)fVar176 | (uint)!bVar17 * auVar93._12_4_);
              bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar17 * (int)fVar164 | (uint)!bVar17 * auVar93._16_4_);
              bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar17 * (int)fVar81 | (uint)!bVar17 * auVar93._20_4_);
              bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar17 * (int)fVar82 | (uint)!bVar17 * auVar93._24_4_);
              bVar17 = SUB81(uVar69 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar93._28_4_);
              auVar93 = vsubps_avx(auVar99,auVar98);
              auVar83 = vfmadd213ps_fma(auVar93,local_2c0,auVar98);
              uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar26._4_4_ = uVar134;
              auVar26._0_4_ = uVar134;
              auVar26._8_4_ = uVar134;
              auVar26._12_4_ = uVar134;
              auVar26._16_4_ = uVar134;
              auVar26._20_4_ = uVar134;
              auVar26._24_4_ = uVar134;
              auVar26._28_4_ = uVar134;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                           CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                    CONCAT44(auVar83._4_4_ +
                                                                             auVar83._4_4_,
                                                                             auVar83._0_4_ +
                                                                             auVar83._0_4_)))),
                                        auVar26);
              uVar80 = vcmpps_avx512vl(local_280,auVar93,6);
              uVar79 = uVar79 & uVar80;
              bVar78 = (byte)uVar79;
              if (bVar78 != 0) {
                auVar162._0_4_ = auVar89._0_4_ * fVar154;
                auVar162._4_4_ = auVar89._4_4_ * fVar133;
                auVar162._8_4_ = auVar89._8_4_ * fVar149;
                auVar162._12_4_ = auVar89._12_4_ * fVar150;
                auVar162._16_4_ = auVar89._16_4_ * 0.0;
                auVar162._20_4_ = auVar89._20_4_ * 0.0;
                auVar162._24_4_ = auVar89._24_4_ * 0.0;
                auVar162._28_4_ = 0;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar93 = vsubps_avx(auVar171,auVar162);
                auVar112._0_4_ =
                     (uint)(bVar68 & 1) * (int)auVar162._0_4_ |
                     (uint)!(bool)(bVar68 & 1) * auVar93._0_4_;
                bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar112._4_4_ = (uint)bVar17 * (int)auVar162._4_4_ | (uint)!bVar17 * auVar93._4_4_;
                bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar112._8_4_ = (uint)bVar17 * (int)auVar162._8_4_ | (uint)!bVar17 * auVar93._8_4_;
                bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar112._12_4_ =
                     (uint)bVar17 * (int)auVar162._12_4_ | (uint)!bVar17 * auVar93._12_4_;
                bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar112._16_4_ =
                     (uint)bVar17 * (int)auVar162._16_4_ | (uint)!bVar17 * auVar93._16_4_;
                bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar112._20_4_ =
                     (uint)bVar17 * (int)auVar162._20_4_ | (uint)!bVar17 * auVar93._20_4_;
                bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar112._24_4_ =
                     (uint)bVar17 * (int)auVar162._24_4_ | (uint)!bVar17 * auVar93._24_4_;
                auVar112._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar93._28_4_;
                auVar27._8_4_ = 0x40000000;
                auVar27._0_8_ = 0x4000000040000000;
                auVar27._12_4_ = 0x40000000;
                auVar27._16_4_ = 0x40000000;
                auVar27._20_4_ = 0x40000000;
                auVar27._24_4_ = 0x40000000;
                auVar27._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar112,auVar171,auVar27);
                local_260 = 0;
                local_25c = iVar14;
                local_250 = local_5b0._0_8_;
                uStack_248 = local_5b0._8_8_;
                local_240 = local_5a0._0_8_;
                uStack_238 = local_5a0._8_8_;
                local_230 = local_5d0._0_8_;
                uStack_228 = local_5d0._8_8_;
                local_220 = local_5c0;
                uStack_218 = uStack_5b8;
                if ((pGVar76->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar154 = 1.0 / auVar192._0_4_;
                  local_200[0] = fVar154 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar154 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar154 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar154 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar154 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar154 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar154 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar143._8_4_ = 0x7f800000;
                  auVar143._0_8_ = 0x7f8000007f800000;
                  auVar143._12_4_ = 0x7f800000;
                  auVar143._16_4_ = 0x7f800000;
                  auVar143._20_4_ = 0x7f800000;
                  auVar143._24_4_ = 0x7f800000;
                  auVar143._28_4_ = 0x7f800000;
                  auVar93 = vblendmps_avx512vl(auVar143,local_280);
                  auVar113._0_4_ =
                       (uint)(bVar78 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
                  auVar113._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                  auVar113._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
                  auVar113._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
                  auVar113._16_4_ = (uint)bVar17 * auVar93._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                  auVar113._20_4_ = (uint)bVar17 * auVar93._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
                  auVar113._24_4_ = (uint)bVar17 * auVar93._24_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = SUB81(uVar79 >> 7,0);
                  auVar113._28_4_ = (uint)bVar17 * auVar93._28_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar93 = vshufps_avx(auVar113,auVar113,0xb1);
                  auVar93 = vminps_avx(auVar113,auVar93);
                  auVar91 = vshufpd_avx(auVar93,auVar93,5);
                  auVar93 = vminps_avx(auVar93,auVar91);
                  auVar91 = vpermpd_avx2(auVar93,0x4e);
                  auVar93 = vminps_avx(auVar93,auVar91);
                  uVar23 = vcmpps_avx512vl(auVar113,auVar93,0);
                  uVar71 = (uint)uVar79;
                  if (((byte)uVar23 & bVar78) != 0) {
                    uVar71 = (uint)((byte)uVar23 & bVar78);
                  }
                  uVar72 = 0;
                  for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                    uVar72 = uVar72 + 1;
                  }
                  uVar69 = (ulong)uVar72;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_550 = vpbroadcastd_avx512vl();
                    auVar83 = vpbroadcastd_avx512vl();
                    local_4c0._0_16_ = auVar83;
                    local_540 = local_280;
                    do {
                      local_420 = local_200[uVar69];
                      local_410 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar69 * 4);
                      local_590.context = context->user;
                      fVar133 = 1.0 - local_420;
                      fVar154 = fVar133 * fVar133 * -3.0;
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),
                                                ZEXT416((uint)(local_420 * fVar133)),
                                                ZEXT416(0xc0000000));
                      auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar133)),
                                                ZEXT416((uint)(local_420 * local_420)),
                                                ZEXT416(0x40000000));
                      fVar133 = auVar83._0_4_ * 3.0;
                      fVar149 = auVar84._0_4_ * 3.0;
                      fVar150 = local_420 * local_420 * 3.0;
                      auVar185._0_4_ = fVar150 * (float)local_5c0._0_4_;
                      auVar185._4_4_ = fVar150 * (float)local_5c0._4_4_;
                      auVar185._8_4_ = fVar150 * (float)uStack_5b8;
                      auVar185._12_4_ = fVar150 * uStack_5b8._4_4_;
                      auVar186 = ZEXT1664(auVar185);
                      auVar137._4_4_ = fVar149;
                      auVar137._0_4_ = fVar149;
                      auVar137._8_4_ = fVar149;
                      auVar137._12_4_ = fVar149;
                      auVar83 = vfmadd132ps_fma(auVar137,auVar185,local_5d0);
                      auVar169._4_4_ = fVar133;
                      auVar169._0_4_ = fVar133;
                      auVar169._8_4_ = fVar133;
                      auVar169._12_4_ = fVar133;
                      auVar83 = vfmadd132ps_fma(auVar169,auVar83,local_5a0);
                      auVar138._4_4_ = fVar154;
                      auVar138._0_4_ = fVar154;
                      auVar138._8_4_ = fVar154;
                      auVar138._12_4_ = fVar154;
                      auVar83 = vfmadd132ps_fma(auVar138,auVar83,local_5b0);
                      local_450 = auVar83._0_4_;
                      local_440 = vshufps_avx(auVar83,auVar83,0x55);
                      auVar181 = ZEXT1664(local_440);
                      local_430 = vshufps_avx(auVar83,auVar83,0xaa);
                      iStack_44c = local_450;
                      iStack_448 = local_450;
                      iStack_444 = local_450;
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      local_400 = local_4c0._0_8_;
                      uStack_3f8 = local_4c0._8_8_;
                      local_3f0 = local_550;
                      vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                      uStack_3dc = (local_590.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_590.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_5e0 = local_4f0;
                      local_590.valid = (int *)local_5e0;
                      local_590.geometryUserPtr = pGVar76->userPtr;
                      local_590.hit = (RTCHitN *)&local_450;
                      local_590.N = 4;
                      local_4a0 = auVar205._0_32_;
                      local_590.ray = (RTCRayN *)ray;
                      if (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar181 = ZEXT1664(local_440);
                        auVar186 = ZEXT1664(auVar185);
                        (*pGVar76->intersectionFilterN)(&local_590);
                        auVar190 = ZEXT3264(local_540);
                        auVar205 = ZEXT3264(local_4a0);
                        auVar208 = ZEXT3264(local_4e0);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar209 = ZEXT1664(auVar83);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar207 = ZEXT3264(auVar93);
                      }
                      uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                      if ((uVar80 & 0xf) == 0) {
LAB_01cefad7:
                        *(int *)(ray + k * 4 + 0x80) = auVar205._0_4_;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar181 = ZEXT1664(auVar181._0_16_);
                          auVar186 = ZEXT1664(auVar186._0_16_);
                          (*p_Var16)(&local_590);
                          auVar190 = ZEXT3264(local_540);
                          auVar205 = ZEXT3264(local_4a0);
                          auVar208 = ZEXT3264(local_4e0);
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar209 = ZEXT1664(auVar83);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar207 = ZEXT3264(auVar93);
                        }
                        uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                        uVar80 = uVar80 & 0xf;
                        bVar78 = (byte)uVar80;
                        if (bVar78 == 0) goto LAB_01cefad7;
                        iVar1 = *(int *)(local_590.hit + 4);
                        iVar2 = *(int *)(local_590.hit + 8);
                        iVar66 = *(int *)(local_590.hit + 0xc);
                        bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar19 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_590.ray + 0xc0) =
                             (uint)(bVar78 & 1) * *(int *)local_590.hit |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xc0);
                        *(uint *)(local_590.ray + 0xc4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xc4);
                        *(uint *)(local_590.ray + 200) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 200);
                        *(uint *)(local_590.ray + 0xcc) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_590.ray + 0xcc);
                        iVar1 = *(int *)(local_590.hit + 0x14);
                        iVar2 = *(int *)(local_590.hit + 0x18);
                        iVar66 = *(int *)(local_590.hit + 0x1c);
                        bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar19 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_590.ray + 0xd0) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x10) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xd0);
                        *(uint *)(local_590.ray + 0xd4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd4);
                        *(uint *)(local_590.ray + 0xd8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd8);
                        *(uint *)(local_590.ray + 0xdc) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_590.ray + 0xdc);
                        iVar1 = *(int *)(local_590.hit + 0x24);
                        iVar2 = *(int *)(local_590.hit + 0x28);
                        iVar66 = *(int *)(local_590.hit + 0x2c);
                        bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar19 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_590.ray + 0xe0) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x20) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xe0);
                        *(uint *)(local_590.ray + 0xe4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe4);
                        *(uint *)(local_590.ray + 0xe8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe8);
                        *(uint *)(local_590.ray + 0xec) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_590.ray + 0xec);
                        iVar1 = *(int *)(local_590.hit + 0x34);
                        iVar2 = *(int *)(local_590.hit + 0x38);
                        iVar66 = *(int *)(local_590.hit + 0x3c);
                        bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar19 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_590.ray + 0xf0) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x30) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xf0);
                        *(uint *)(local_590.ray + 0xf4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf4);
                        *(uint *)(local_590.ray + 0xf8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf8);
                        *(uint *)(local_590.ray + 0xfc) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_590.ray + 0xfc);
                        iVar1 = *(int *)(local_590.hit + 0x44);
                        iVar2 = *(int *)(local_590.hit + 0x48);
                        iVar66 = *(int *)(local_590.hit + 0x4c);
                        bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar19 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_590.ray + 0x100) =
                             (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x40) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0x100);
                        *(uint *)(local_590.ray + 0x104) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0x104);
                        *(uint *)(local_590.ray + 0x108) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0x108);
                        *(uint *)(local_590.ray + 0x10c) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_590.ray + 0x10c)
                        ;
                        auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                        *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar83;
                        auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                        *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar83;
                        auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                        *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar83;
                        auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                        *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar83;
                        auVar205 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      bVar78 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar79;
                      uVar134 = auVar205._0_4_;
                      auVar147._4_4_ = uVar134;
                      auVar147._0_4_ = uVar134;
                      auVar147._8_4_ = uVar134;
                      auVar147._12_4_ = uVar134;
                      auVar147._16_4_ = uVar134;
                      auVar147._20_4_ = uVar134;
                      auVar147._24_4_ = uVar134;
                      auVar147._28_4_ = uVar134;
                      uVar23 = vcmpps_avx512vl(auVar190._0_32_,auVar147,2);
                      if ((bVar78 & (byte)uVar23) == 0) goto LAB_01ceea5d;
                      bVar78 = bVar78 & (byte)uVar23;
                      uVar79 = (ulong)bVar78;
                      auVar148._8_4_ = 0x7f800000;
                      auVar148._0_8_ = 0x7f8000007f800000;
                      auVar148._12_4_ = 0x7f800000;
                      auVar148._16_4_ = 0x7f800000;
                      auVar148._20_4_ = 0x7f800000;
                      auVar148._24_4_ = 0x7f800000;
                      auVar148._28_4_ = 0x7f800000;
                      auVar93 = vblendmps_avx512vl(auVar148,auVar190._0_32_);
                      auVar126._0_4_ =
                           (uint)(bVar78 & 1) * auVar93._0_4_ |
                           (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                      bVar17 = (bool)(bVar78 >> 1 & 1);
                      auVar126._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar78 >> 2 & 1);
                      auVar126._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar78 >> 3 & 1);
                      auVar126._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar78 >> 4 & 1);
                      auVar126._16_4_ = (uint)bVar17 * auVar93._16_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar78 >> 5 & 1);
                      auVar126._20_4_ = (uint)bVar17 * auVar93._20_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar78 >> 6 & 1);
                      auVar126._24_4_ = (uint)bVar17 * auVar93._24_4_ | (uint)!bVar17 * 0x7f800000;
                      auVar126._28_4_ =
                           (uint)(bVar78 >> 7) * auVar93._28_4_ |
                           (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                      auVar93 = vshufps_avx(auVar126,auVar126,0xb1);
                      auVar93 = vminps_avx(auVar126,auVar93);
                      auVar91 = vshufpd_avx(auVar93,auVar93,5);
                      auVar93 = vminps_avx(auVar93,auVar91);
                      auVar91 = vpermpd_avx2(auVar93,0x4e);
                      auVar93 = vminps_avx(auVar93,auVar91);
                      uVar23 = vcmpps_avx512vl(auVar126,auVar93,0);
                      bVar68 = (byte)uVar23 & bVar78;
                      if (bVar68 != 0) {
                        bVar78 = bVar68;
                      }
                      uVar71 = 0;
                      for (uVar72 = (uint)bVar78; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x80000000) {
                        uVar71 = uVar71 + 1;
                      }
                      uVar69 = (ulong)uVar71;
                    } while( true );
                  }
                  fVar154 = local_200[uVar69];
                  uVar134 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                  fVar149 = 1.0 - fVar154;
                  fVar133 = fVar149 * fVar149 * -3.0;
                  auVar181 = ZEXT464((uint)fVar133);
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                            ZEXT416((uint)(fVar154 * fVar149)),ZEXT416(0xc0000000));
                  auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar154 * fVar149)),
                                            ZEXT416((uint)(fVar154 * fVar154)),ZEXT416(0x40000000));
                  fVar149 = auVar83._0_4_ * 3.0;
                  fVar150 = auVar84._0_4_ * 3.0;
                  fVar165 = fVar154 * fVar154 * 3.0;
                  auVar182._0_4_ = fVar165 * (float)local_5c0._0_4_;
                  auVar182._4_4_ = fVar165 * (float)local_5c0._4_4_;
                  auVar182._8_4_ = fVar165 * (float)uStack_5b8;
                  auVar182._12_4_ = fVar165 * uStack_5b8._4_4_;
                  auVar186 = ZEXT1664(auVar182);
                  auVar157._4_4_ = fVar150;
                  auVar157._0_4_ = fVar150;
                  auVar157._8_4_ = fVar150;
                  auVar157._12_4_ = fVar150;
                  auVar83 = vfmadd132ps_fma(auVar157,auVar182,local_5d0);
                  auVar166._4_4_ = fVar149;
                  auVar166._0_4_ = fVar149;
                  auVar166._8_4_ = fVar149;
                  auVar166._12_4_ = fVar149;
                  auVar83 = vfmadd132ps_fma(auVar166,auVar83,local_5a0);
                  auVar158._4_4_ = fVar133;
                  auVar158._0_4_ = fVar133;
                  auVar158._8_4_ = fVar133;
                  auVar158._12_4_ = fVar133;
                  auVar83 = vfmadd132ps_fma(auVar158,auVar83,local_5b0);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar69 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                  uVar15 = vextractps_avx(auVar83,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                  uVar15 = vextractps_avx(auVar83,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                  *(float *)(ray + k * 4 + 0xf0) = fVar154;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar134;
                  *(uint *)(ray + k * 4 + 0x110) = uVar13;
                  *(uint *)(ray + k * 4 + 0x120) = uVar77;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01ceea5d:
      if (8 < iVar14) {
        auVar93 = vpbroadcastd_avx512vl();
        auVar205 = ZEXT3264(auVar93);
        local_4a0._4_4_ = local_520._0_4_;
        local_4a0._0_4_ = local_520._0_4_;
        local_4a0._8_4_ = local_520._0_4_;
        local_4a0._12_4_ = local_520._0_4_;
        local_4a0._16_4_ = local_520._0_4_;
        local_4a0._20_4_ = local_520._0_4_;
        local_4a0._24_4_ = local_520._0_4_;
        local_4a0._28_4_ = local_520._0_4_;
        uStack_47c = local_480;
        uStack_478 = local_480;
        uStack_474 = local_480;
        uStack_470 = local_480;
        uStack_46c = local_480;
        uStack_468 = local_480;
        uStack_464 = local_480;
        local_120 = 1.0 / (float)local_560._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_560 = vpbroadcastd_avx512vl();
        local_550 = vpbroadcastd_avx512vl();
        lVar75 = 8;
LAB_01ceeb0e:
        auVar93 = vpbroadcastd_avx512vl();
        auVar93 = vpor_avx2(auVar93,_DAT_01fe9900);
        uVar24 = vpcmpgtd_avx512vl(auVar205._0_32_,auVar93);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar65);
        auVar91 = *(undefined1 (*) [32])(lVar65 + 0x21aa768 + lVar75 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar65 + 0x21aabec + lVar75 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar65 + 0x21ab070 + lVar75 * 4);
        auVar206._0_4_ = auVar101._0_4_ * (float)local_3a0._0_4_;
        auVar206._4_4_ = auVar101._4_4_ * (float)local_3a0._4_4_;
        auVar206._8_4_ = auVar101._8_4_ * fStack_398;
        auVar206._12_4_ = auVar101._12_4_ * fStack_394;
        auVar206._16_4_ = auVar101._16_4_ * fStack_390;
        auVar206._20_4_ = auVar101._20_4_ * fStack_38c;
        auVar206._28_36_ = auVar186._28_36_;
        auVar206._24_4_ = auVar101._24_4_ * fStack_388;
        auVar186._0_4_ = auVar101._0_4_ * (float)local_3c0._0_4_;
        auVar186._4_4_ = auVar101._4_4_ * (float)local_3c0._4_4_;
        auVar186._8_4_ = auVar101._8_4_ * fStack_3b8;
        auVar186._12_4_ = auVar101._12_4_ * fStack_3b4;
        auVar186._16_4_ = auVar101._16_4_ * fStack_3b0;
        auVar186._20_4_ = auVar101._20_4_ * fStack_3ac;
        auVar186._28_36_ = auVar181._28_36_;
        auVar186._24_4_ = auVar101._24_4_ * fStack_3a8;
        auVar94 = vmulps_avx512vl(local_e0,auVar101);
        auVar92 = vfmadd231ps_avx512vl(auVar206._0_32_,auVar102,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar102,local_380);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar91,local_a0);
        auVar83 = vfmadd231ps_fma(auVar92,auVar93,local_2e0);
        auVar186 = ZEXT1664(auVar83);
        auVar84 = vfmadd231ps_fma(auVar100,auVar93,local_300);
        auVar181 = ZEXT1664(auVar84);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar65);
        auVar92 = *(undefined1 (*) [32])(lVar65 + 0x21acb88 + lVar75 * 4);
        auVar89 = vfmadd231ps_avx512vl(auVar95,auVar93,local_100);
        auVar100 = *(undefined1 (*) [32])(lVar65 + 0x21ad00c + lVar75 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar65 + 0x21ad490 + lVar75 * 4);
        auVar191._0_4_ = auVar95._0_4_ * (float)local_3a0._0_4_;
        auVar191._4_4_ = auVar95._4_4_ * (float)local_3a0._4_4_;
        auVar191._8_4_ = auVar95._8_4_ * fStack_398;
        auVar191._12_4_ = auVar95._12_4_ * fStack_394;
        auVar191._16_4_ = auVar95._16_4_ * fStack_390;
        auVar191._20_4_ = auVar95._20_4_ * fStack_38c;
        auVar191._28_36_ = auVar190._28_36_;
        auVar191._24_4_ = auVar95._24_4_ * fStack_388;
        auVar48._4_4_ = auVar95._4_4_ * (float)local_3c0._4_4_;
        auVar48._0_4_ = auVar95._0_4_ * (float)local_3c0._0_4_;
        auVar48._8_4_ = auVar95._8_4_ * fStack_3b8;
        auVar48._12_4_ = auVar95._12_4_ * fStack_3b4;
        auVar48._16_4_ = auVar95._16_4_ * fStack_3b0;
        auVar48._20_4_ = auVar95._20_4_ * fStack_3ac;
        auVar48._24_4_ = auVar95._24_4_ * fStack_3a8;
        auVar48._28_4_ = uStack_3a4;
        auVar96 = vmulps_avx512vl(local_e0,auVar95);
        auVar97 = vfmadd231ps_avx512vl(auVar191._0_32_,auVar100,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar48,auVar100,local_380);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_340);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_a0);
        auVar5 = vfmadd231ps_fma(auVar97,auVar94,local_2e0);
        auVar190 = ZEXT1664(auVar5);
        auVar6 = vfmadd231ps_fma(auVar98,auVar94,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar96,auVar94,local_100);
        auVar99 = vmaxps_avx512vl(auVar89,auVar98);
        auVar96 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar83));
        auVar97 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar84));
        auVar87 = vmulps_avx512vl(ZEXT1632(auVar84),auVar96);
        auVar88 = vmulps_avx512vl(ZEXT1632(auVar83),auVar97);
        auVar87 = vsubps_avx512vl(auVar87,auVar88);
        auVar88 = vmulps_avx512vl(auVar97,auVar97);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar96);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar88);
        auVar87 = vmulps_avx512vl(auVar87,auVar87);
        uVar23 = vcmpps_avx512vl(auVar87,auVar99,2);
        bVar78 = (byte)uVar24 & (byte)uVar23;
        if (bVar78 != 0) {
          in_ZMM25 = ZEXT3264(local_1a0);
          auVar95 = vmulps_avx512vl(local_1a0,auVar95);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_180,auVar95);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar100);
          local_4e0 = auVar208._0_32_;
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_4e0,auVar92);
          auVar101 = vmulps_avx512vl(local_1a0,auVar101);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar101);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar102);
          auVar92 = vfmadd213ps_avx512vl(auVar93,local_4e0,auVar91);
          auVar93 = *(undefined1 (*) [32])(lVar65 + 0x21ab4f4 + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar65 + 0x21ab978 + lVar75 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar65 + 0x21abdfc + lVar75 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar65 + 0x21ac280 + lVar75 * 4);
          auVar100 = vmulps_avx512vl(_local_3a0,auVar101);
          auVar95 = vmulps_avx512vl(_local_3c0,auVar101);
          auVar101 = vmulps_avx512vl(local_1a0,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_360);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,local_380);
          auVar102 = vfmadd231ps_avx512vl(auVar101,local_180,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar100,auVar91,local_320);
          auVar100 = vfmadd231ps_avx512vl(auVar95,auVar91,local_340);
          auVar91 = vfmadd231ps_avx512vl(auVar102,local_160,auVar91);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_2e0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar93,local_300);
          auVar95 = vfmadd231ps_avx512vl(auVar91,local_4e0,auVar93);
          auVar93 = *(undefined1 (*) [32])(lVar65 + 0x21ad914 + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar65 + 0x21ae21c + lVar75 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar65 + 0x21ae6a0 + lVar75 * 4);
          auVar99 = vmulps_avx512vl(_local_3a0,auVar102);
          auVar87 = vmulps_avx512vl(_local_3c0,auVar102);
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_380);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_180,auVar91);
          auVar91 = *(undefined1 (*) [32])(lVar65 + 0x21add98 + lVar75 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,local_320);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_340);
          auVar91 = vfmadd231ps_avx512vl(auVar102,local_160,auVar91);
          auVar102 = vfmadd231ps_avx512vl(auVar99,auVar93,local_2e0);
          auVar99 = vfmadd231ps_avx512vl(auVar87,auVar93,local_300);
          auVar91 = vfmadd231ps_avx512vl(auVar91,local_4e0,auVar93);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar101,auVar87);
          vandps_avx512vl(auVar100,auVar87);
          auVar93 = vmaxps_avx(auVar87,auVar87);
          vandps_avx512vl(auVar95,auVar87);
          auVar93 = vmaxps_avx(auVar93,auVar87);
          uVar69 = vcmpps_avx512vl(auVar93,local_4a0,1);
          bVar17 = (bool)((byte)uVar69 & 1);
          auVar114._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar101._0_4_);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar101._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar101._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar101._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar101._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar101._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar101._24_4_)
          ;
          bVar17 = SUB81(uVar69 >> 7,0);
          auVar114._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar101._28_4_;
          bVar17 = (bool)((byte)uVar69 & 1);
          auVar115._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar100._0_4_);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar100._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar100._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar100._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar100._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar100._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar100._24_4_)
          ;
          bVar17 = SUB81(uVar69 >> 7,0);
          auVar115._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar100._28_4_;
          vandps_avx512vl(auVar102,auVar87);
          vandps_avx512vl(auVar99,auVar87);
          auVar93 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar91,auVar87);
          auVar93 = vmaxps_avx(auVar93,auVar115);
          uVar69 = vcmpps_avx512vl(auVar93,local_4a0,1);
          bVar17 = (bool)((byte)uVar69 & 1);
          auVar116._0_4_ = (uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar102._0_4_;
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar102._4_4_;
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar102._8_4_;
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar102._12_4_;
          bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar102._16_4_;
          bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar102._20_4_;
          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar102._24_4_;
          bVar17 = SUB81(uVar69 >> 7,0);
          auVar116._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar102._28_4_;
          bVar17 = (bool)((byte)uVar69 & 1);
          auVar117._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar99._0_4_);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar99._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar99._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar99._12_4_);
          bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar99._16_4_);
          bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar99._20_4_);
          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar99._24_4_);
          bVar17 = SUB81(uVar69 >> 7,0);
          auVar117._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar99._28_4_;
          auVar193._8_4_ = 0x80000000;
          auVar193._0_8_ = 0x8000000080000000;
          auVar193._12_4_ = 0x80000000;
          auVar193._16_4_ = 0x80000000;
          auVar193._20_4_ = 0x80000000;
          auVar193._24_4_ = 0x80000000;
          auVar193._28_4_ = 0x80000000;
          auVar93 = vxorps_avx512vl(auVar116,auVar193);
          auVar86 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
          auVar91 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar86));
          auVar7 = vfmadd231ps_fma(auVar91,auVar115,auVar115);
          auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar203._8_4_ = 0xbf000000;
          auVar203._0_8_ = 0xbf000000bf000000;
          auVar203._12_4_ = 0xbf000000;
          auVar203._16_4_ = 0xbf000000;
          auVar203._20_4_ = 0xbf000000;
          auVar203._24_4_ = 0xbf000000;
          auVar203._28_4_ = 0xbf000000;
          fVar154 = auVar91._0_4_;
          fVar133 = auVar91._4_4_;
          fVar149 = auVar91._8_4_;
          fVar150 = auVar91._12_4_;
          fVar165 = auVar91._16_4_;
          fVar174 = auVar91._20_4_;
          fVar175 = auVar91._24_4_;
          auVar49._4_4_ = fVar133 * fVar133 * fVar133 * auVar7._4_4_ * -0.5;
          auVar49._0_4_ = fVar154 * fVar154 * fVar154 * auVar7._0_4_ * -0.5;
          auVar49._8_4_ = fVar149 * fVar149 * fVar149 * auVar7._8_4_ * -0.5;
          auVar49._12_4_ = fVar150 * fVar150 * fVar150 * auVar7._12_4_ * -0.5;
          auVar49._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar49._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar49._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar49._28_4_ = auVar115._28_4_;
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar91 = vfmadd231ps_avx512vl(auVar49,auVar102,auVar91);
          auVar50._4_4_ = auVar115._4_4_ * auVar91._4_4_;
          auVar50._0_4_ = auVar115._0_4_ * auVar91._0_4_;
          auVar50._8_4_ = auVar115._8_4_ * auVar91._8_4_;
          auVar50._12_4_ = auVar115._12_4_ * auVar91._12_4_;
          auVar50._16_4_ = auVar115._16_4_ * auVar91._16_4_;
          auVar50._20_4_ = auVar115._20_4_ * auVar91._20_4_;
          auVar50._24_4_ = auVar115._24_4_ * auVar91._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar91._4_4_ * -auVar114._4_4_;
          auVar51._0_4_ = auVar91._0_4_ * -auVar114._0_4_;
          auVar51._8_4_ = auVar91._8_4_ * -auVar114._8_4_;
          auVar51._12_4_ = auVar91._12_4_ * -auVar114._12_4_;
          auVar51._16_4_ = auVar91._16_4_ * -auVar114._16_4_;
          auVar51._20_4_ = auVar91._20_4_ * -auVar114._20_4_;
          auVar51._24_4_ = auVar91._24_4_ * -auVar114._24_4_;
          auVar51._28_4_ = auVar115._28_4_;
          auVar101 = vmulps_avx512vl(auVar91,ZEXT1632(auVar86));
          auVar95 = ZEXT1632(auVar86);
          auVar91 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar95);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar117,auVar117);
          auVar100 = vrsqrt14ps_avx512vl(auVar91);
          auVar91 = vmulps_avx512vl(auVar91,auVar203);
          fVar154 = auVar100._0_4_;
          fVar133 = auVar100._4_4_;
          fVar149 = auVar100._8_4_;
          fVar150 = auVar100._12_4_;
          fVar165 = auVar100._16_4_;
          fVar174 = auVar100._20_4_;
          fVar175 = auVar100._24_4_;
          auVar52._4_4_ = fVar133 * fVar133 * fVar133 * auVar91._4_4_;
          auVar52._0_4_ = fVar154 * fVar154 * fVar154 * auVar91._0_4_;
          auVar52._8_4_ = fVar149 * fVar149 * fVar149 * auVar91._8_4_;
          auVar52._12_4_ = fVar150 * fVar150 * fVar150 * auVar91._12_4_;
          auVar52._16_4_ = fVar165 * fVar165 * fVar165 * auVar91._16_4_;
          auVar52._20_4_ = fVar174 * fVar174 * fVar174 * auVar91._20_4_;
          auVar52._24_4_ = fVar175 * fVar175 * fVar175 * auVar91._24_4_;
          auVar52._28_4_ = auVar91._28_4_;
          auVar91 = vfmadd231ps_avx512vl(auVar52,auVar102,auVar100);
          auVar53._4_4_ = auVar117._4_4_ * auVar91._4_4_;
          auVar53._0_4_ = auVar117._0_4_ * auVar91._0_4_;
          auVar53._8_4_ = auVar117._8_4_ * auVar91._8_4_;
          auVar53._12_4_ = auVar117._12_4_ * auVar91._12_4_;
          auVar53._16_4_ = auVar117._16_4_ * auVar91._16_4_;
          auVar53._20_4_ = auVar117._20_4_ * auVar91._20_4_;
          auVar53._24_4_ = auVar117._24_4_ * auVar91._24_4_;
          auVar53._28_4_ = auVar100._28_4_;
          auVar54._4_4_ = auVar91._4_4_ * auVar93._4_4_;
          auVar54._0_4_ = auVar91._0_4_ * auVar93._0_4_;
          auVar54._8_4_ = auVar91._8_4_ * auVar93._8_4_;
          auVar54._12_4_ = auVar91._12_4_ * auVar93._12_4_;
          auVar54._16_4_ = auVar91._16_4_ * auVar93._16_4_;
          auVar54._20_4_ = auVar91._20_4_ * auVar93._20_4_;
          auVar54._24_4_ = auVar91._24_4_ * auVar93._24_4_;
          auVar54._28_4_ = auVar93._28_4_;
          auVar93 = vmulps_avx512vl(auVar91,auVar95);
          auVar7 = vfmadd213ps_fma(auVar50,auVar89,ZEXT1632(auVar83));
          auVar8 = vfmadd213ps_fma(auVar51,auVar89,ZEXT1632(auVar84));
          auVar102 = vfmadd213ps_avx512vl(auVar101,auVar89,auVar92);
          auVar100 = vfmadd213ps_avx512vl(auVar53,auVar98,ZEXT1632(auVar5));
          auVar10 = vfnmadd213ps_fma(auVar50,auVar89,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar51,auVar89,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar93,auVar98,auVar94);
          auVar155 = vfnmadd231ps_fma(auVar92,auVar89,auVar101);
          auVar151 = vfnmadd213ps_fma(auVar53,auVar98,ZEXT1632(auVar5));
          auVar85 = vfnmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar6));
          auVar156 = vfnmadd231ps_fma(auVar94,auVar98,auVar93);
          auVar94 = vsubps_avx512vl(auVar100,ZEXT1632(auVar10));
          auVar93 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar11));
          auVar91 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar155));
          auVar55._4_4_ = auVar93._4_4_ * auVar155._4_4_;
          auVar55._0_4_ = auVar93._0_4_ * auVar155._0_4_;
          auVar55._8_4_ = auVar93._8_4_ * auVar155._8_4_;
          auVar55._12_4_ = auVar93._12_4_ * auVar155._12_4_;
          auVar55._16_4_ = auVar93._16_4_ * 0.0;
          auVar55._20_4_ = auVar93._20_4_ * 0.0;
          auVar55._24_4_ = auVar93._24_4_ * 0.0;
          auVar55._28_4_ = auVar101._28_4_;
          auVar5 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar11),auVar91);
          auVar56._4_4_ = auVar91._4_4_ * auVar10._4_4_;
          auVar56._0_4_ = auVar91._0_4_ * auVar10._0_4_;
          auVar56._8_4_ = auVar91._8_4_ * auVar10._8_4_;
          auVar56._12_4_ = auVar91._12_4_ * auVar10._12_4_;
          auVar56._16_4_ = auVar91._16_4_ * 0.0;
          auVar56._20_4_ = auVar91._20_4_ * 0.0;
          auVar56._24_4_ = auVar91._24_4_ * 0.0;
          auVar56._28_4_ = auVar91._28_4_;
          auVar6 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar155),auVar94);
          auVar57._4_4_ = auVar11._4_4_ * auVar94._4_4_;
          auVar57._0_4_ = auVar11._0_4_ * auVar94._0_4_;
          auVar57._8_4_ = auVar11._8_4_ * auVar94._8_4_;
          auVar57._12_4_ = auVar11._12_4_ * auVar94._12_4_;
          auVar57._16_4_ = auVar94._16_4_ * 0.0;
          auVar57._20_4_ = auVar94._20_4_ * 0.0;
          auVar57._24_4_ = auVar94._24_4_ * 0.0;
          auVar57._28_4_ = auVar94._28_4_;
          auVar9 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar10),auVar93);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar95,ZEXT1632(auVar6));
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,ZEXT1632(auVar5));
          auVar87 = ZEXT1632(auVar86);
          uVar69 = vcmpps_avx512vl(auVar93,auVar87,2);
          bVar68 = (byte)uVar69;
          fVar81 = (float)((uint)(bVar68 & 1) * auVar7._0_4_ |
                          (uint)!(bool)(bVar68 & 1) * auVar151._0_4_);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar127 = (float)((uint)bVar17 * auVar7._4_4_ | (uint)!bVar17 * auVar151._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar129 = (float)((uint)bVar17 * auVar7._8_4_ | (uint)!bVar17 * auVar151._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar131 = (float)((uint)bVar17 * auVar7._12_4_ | (uint)!bVar17 * auVar151._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar81))));
          fVar82 = (float)((uint)(bVar68 & 1) * auVar8._0_4_ |
                          (uint)!(bool)(bVar68 & 1) * auVar85._0_4_);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar128 = (float)((uint)bVar17 * auVar8._4_4_ | (uint)!bVar17 * auVar85._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar130 = (float)((uint)bVar17 * auVar8._8_4_ | (uint)!bVar17 * auVar85._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar132 = (float)((uint)bVar17 * auVar8._12_4_ | (uint)!bVar17 * auVar85._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar82))));
          auVar118._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar156._0_4_);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar156._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar156._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ =
               (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar156._12_4_);
          fVar154 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar102._16_4_);
          auVar118._16_4_ = fVar154;
          fVar133 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar102._20_4_);
          auVar118._20_4_ = fVar133;
          fVar149 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar102._24_4_);
          auVar118._24_4_ = fVar149;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar102._28_4_;
          auVar118._28_4_ = iVar1;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar100);
          auVar119._0_4_ =
               (uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar5._0_4_;
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar5._4_4_;
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar5._8_4_;
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar5._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar83));
          auVar120._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_
                      );
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar7._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar7._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar7._12_4_);
          fVar174 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
          auVar120._16_4_ = fVar174;
          fVar165 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
          auVar120._20_4_ = fVar165;
          fVar150 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
          auVar120._24_4_ = fVar150;
          auVar120._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar155),ZEXT1632(auVar84));
          auVar121._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
                      );
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar8._4_4_);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar8._8_4_);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar8._12_4_);
          fVar164 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
          auVar121._16_4_ = fVar164;
          fVar176 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
          auVar121._20_4_ = fVar176;
          fVar175 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
          auVar121._24_4_ = fVar175;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
          auVar121._28_4_ = iVar2;
          auVar122._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar100._0_4_;
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar17 * (int)auVar10._4_4_ | (uint)!bVar17 * auVar100._4_4_;
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar17 * (int)auVar10._8_4_ | (uint)!bVar17 * auVar100._8_4_;
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar17 * (int)auVar10._12_4_ | (uint)!bVar17 * auVar100._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar100._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar100._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar100._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar100._28_4_;
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar122,auVar95);
          auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar11._12_4_ |
                                                  (uint)!bVar21 * auVar83._12_4_,
                                                  CONCAT48((uint)bVar19 * (int)auVar11._8_4_ |
                                                           (uint)!bVar19 * auVar83._8_4_,
                                                           CONCAT44((uint)bVar17 *
                                                                    (int)auVar11._4_4_ |
                                                                    (uint)!bVar17 * auVar83._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar11._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar83._0_4_)))),auVar96);
          auVar186 = ZEXT3264(auVar91);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar155._12_4_ |
                                                   (uint)!bVar22 * auVar84._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar155._8_4_ |
                                                            (uint)!bVar20 * auVar84._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar155._4_4_ |
                                                                     (uint)!bVar18 * auVar84._4_4_,
                                                                     (uint)(bVar68 & 1) *
                                                                     (int)auVar155._0_4_ |
                                                                     (uint)!(bool)(bVar68 & 1) *
                                                                     auVar84._0_4_)))),auVar118);
          auVar101 = vsubps_avx(auVar95,auVar119);
          auVar190 = ZEXT3264(auVar101);
          auVar94 = vsubps_avx(auVar96,auVar120);
          auVar92 = vsubps_avx(auVar118,auVar121);
          auVar58._4_4_ = auVar102._4_4_ * fVar127;
          auVar58._0_4_ = auVar102._0_4_ * fVar81;
          auVar58._8_4_ = auVar102._8_4_ * fVar129;
          auVar58._12_4_ = auVar102._12_4_ * fVar131;
          auVar58._16_4_ = auVar102._16_4_ * 0.0;
          auVar58._20_4_ = auVar102._20_4_ * 0.0;
          auVar58._24_4_ = auVar102._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar58,auVar118,auVar100);
          auVar172._0_4_ = fVar82 * auVar100._0_4_;
          auVar172._4_4_ = fVar128 * auVar100._4_4_;
          auVar172._8_4_ = fVar130 * auVar100._8_4_;
          auVar172._12_4_ = fVar132 * auVar100._12_4_;
          auVar172._16_4_ = auVar100._16_4_ * 0.0;
          auVar172._20_4_ = auVar100._20_4_ * 0.0;
          auVar172._24_4_ = auVar100._24_4_ * 0.0;
          auVar172._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar172,auVar95,auVar91);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar87,ZEXT1632(auVar83));
          auVar179._0_4_ = auVar91._0_4_ * auVar118._0_4_;
          auVar179._4_4_ = auVar91._4_4_ * auVar118._4_4_;
          auVar179._8_4_ = auVar91._8_4_ * auVar118._8_4_;
          auVar179._12_4_ = auVar91._12_4_ * auVar118._12_4_;
          auVar179._16_4_ = auVar91._16_4_ * fVar154;
          auVar179._20_4_ = auVar91._20_4_ * fVar133;
          auVar179._24_4_ = auVar91._24_4_ * fVar149;
          auVar179._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar179,auVar96,auVar102);
          auVar97 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar83));
          auVar93 = vmulps_avx512vl(auVar92,auVar119);
          auVar93 = vfmsub231ps_avx512vl(auVar93,auVar101,auVar121);
          auVar59._4_4_ = auVar94._4_4_ * auVar121._4_4_;
          auVar59._0_4_ = auVar94._0_4_ * auVar121._0_4_;
          auVar59._8_4_ = auVar94._8_4_ * auVar121._8_4_;
          auVar59._12_4_ = auVar94._12_4_ * auVar121._12_4_;
          auVar59._16_4_ = auVar94._16_4_ * fVar164;
          auVar59._20_4_ = auVar94._20_4_ * fVar176;
          auVar59._24_4_ = auVar94._24_4_ * fVar175;
          auVar59._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar59,auVar120,auVar92);
          auVar180._0_4_ = auVar120._0_4_ * auVar101._0_4_;
          auVar180._4_4_ = auVar120._4_4_ * auVar101._4_4_;
          auVar180._8_4_ = auVar120._8_4_ * auVar101._8_4_;
          auVar180._12_4_ = auVar120._12_4_ * auVar101._12_4_;
          auVar180._16_4_ = fVar174 * auVar101._16_4_;
          auVar180._20_4_ = fVar165 * auVar101._20_4_;
          auVar180._24_4_ = fVar150 * auVar101._24_4_;
          auVar180._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar180,auVar94,auVar119);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar87,auVar93);
          auVar99 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar83));
          auVar181 = ZEXT3264(auVar99);
          auVar93 = vmaxps_avx(auVar97,auVar99);
          uVar23 = vcmpps_avx512vl(auVar93,auVar87,2);
          bVar78 = bVar78 & (byte)uVar23;
          if (bVar78 != 0) {
            uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar204._4_4_ = uVar134;
            auVar204._0_4_ = uVar134;
            auVar204._8_4_ = uVar134;
            auVar204._12_4_ = uVar134;
            auVar204._16_4_ = uVar134;
            auVar204._20_4_ = uVar134;
            auVar204._24_4_ = uVar134;
            auVar204._28_4_ = uVar134;
            auVar206 = ZEXT3264(auVar204);
            auVar60._4_4_ = auVar92._4_4_ * auVar91._4_4_;
            auVar60._0_4_ = auVar92._0_4_ * auVar91._0_4_;
            auVar60._8_4_ = auVar92._8_4_ * auVar91._8_4_;
            auVar60._12_4_ = auVar92._12_4_ * auVar91._12_4_;
            auVar60._16_4_ = auVar92._16_4_ * auVar91._16_4_;
            auVar60._20_4_ = auVar92._20_4_ * auVar91._20_4_;
            auVar60._24_4_ = auVar92._24_4_ * auVar91._24_4_;
            auVar60._28_4_ = auVar93._28_4_;
            auVar6 = vfmsub231ps_fma(auVar60,auVar94,auVar102);
            auVar61._4_4_ = auVar102._4_4_ * auVar101._4_4_;
            auVar61._0_4_ = auVar102._0_4_ * auVar101._0_4_;
            auVar61._8_4_ = auVar102._8_4_ * auVar101._8_4_;
            auVar61._12_4_ = auVar102._12_4_ * auVar101._12_4_;
            auVar61._16_4_ = auVar102._16_4_ * auVar101._16_4_;
            auVar61._20_4_ = auVar102._20_4_ * auVar101._20_4_;
            auVar61._24_4_ = auVar102._24_4_ * auVar101._24_4_;
            auVar61._28_4_ = auVar102._28_4_;
            auVar5 = vfmsub231ps_fma(auVar61,auVar100,auVar92);
            auVar62._4_4_ = auVar94._4_4_ * auVar100._4_4_;
            auVar62._0_4_ = auVar94._0_4_ * auVar100._0_4_;
            auVar62._8_4_ = auVar94._8_4_ * auVar100._8_4_;
            auVar62._12_4_ = auVar94._12_4_ * auVar100._12_4_;
            auVar62._16_4_ = auVar94._16_4_ * auVar100._16_4_;
            auVar62._20_4_ = auVar94._20_4_ * auVar100._20_4_;
            auVar62._24_4_ = auVar94._24_4_ * auVar100._24_4_;
            auVar62._28_4_ = auVar94._28_4_;
            auVar7 = vfmsub231ps_fma(auVar62,auVar101,auVar91);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar5),ZEXT1632(auVar7));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar6),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar93 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
            auVar29._8_4_ = 0x3f800000;
            auVar29._0_8_ = 0x3f8000003f800000;
            auVar29._12_4_ = 0x3f800000;
            auVar29._16_4_ = 0x3f800000;
            auVar29._20_4_ = 0x3f800000;
            auVar29._24_4_ = 0x3f800000;
            auVar29._28_4_ = 0x3f800000;
            auVar91 = vfnmadd213ps_avx512vl(auVar93,ZEXT1632(auVar84),auVar29);
            auVar83 = vfmadd132ps_fma(auVar91,auVar93,auVar93);
            auVar186 = ZEXT1664(auVar83);
            auVar63._4_4_ = auVar7._4_4_ * auVar118._4_4_;
            auVar63._0_4_ = auVar7._0_4_ * auVar118._0_4_;
            auVar63._8_4_ = auVar7._8_4_ * auVar118._8_4_;
            auVar63._12_4_ = auVar7._12_4_ * auVar118._12_4_;
            auVar63._16_4_ = fVar154 * 0.0;
            auVar63._20_4_ = fVar133 * 0.0;
            auVar63._24_4_ = fVar149 * 0.0;
            auVar63._28_4_ = iVar1;
            auVar5 = vfmadd231ps_fma(auVar63,auVar96,ZEXT1632(auVar5));
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar95,ZEXT1632(auVar6));
            fVar154 = auVar83._0_4_;
            fVar133 = auVar83._4_4_;
            fVar149 = auVar83._8_4_;
            fVar150 = auVar83._12_4_;
            local_280._28_4_ = auVar93._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar5._12_4_ * fVar150,
                                    CONCAT48(auVar5._8_4_ * fVar149,
                                             CONCAT44(auVar5._4_4_ * fVar133,auVar5._0_4_ * fVar154)
                                            )));
            auVar190 = ZEXT3264(local_280);
            uVar23 = vcmpps_avx512vl(local_280,auVar204,2);
            auVar67._4_4_ = uStack_47c;
            auVar67._0_4_ = local_480;
            auVar67._8_4_ = uStack_478;
            auVar67._12_4_ = uStack_474;
            auVar67._16_4_ = uStack_470;
            auVar67._20_4_ = uStack_46c;
            auVar67._24_4_ = uStack_468;
            auVar67._28_4_ = uStack_464;
            uVar24 = vcmpps_avx512vl(local_280,auVar67,0xd);
            bVar78 = (byte)uVar23 & (byte)uVar24 & bVar78;
            if (bVar78 != 0) {
              uVar79 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar79 = bVar78 & uVar79;
              if ((char)uVar79 != '\0') {
                fVar165 = auVar97._0_4_ * fVar154;
                fVar174 = auVar97._4_4_ * fVar133;
                auVar64._4_4_ = fVar174;
                auVar64._0_4_ = fVar165;
                fVar175 = auVar97._8_4_ * fVar149;
                auVar64._8_4_ = fVar175;
                fVar176 = auVar97._12_4_ * fVar150;
                auVar64._12_4_ = fVar176;
                fVar164 = auVar97._16_4_ * 0.0;
                auVar64._16_4_ = fVar164;
                fVar81 = auVar97._20_4_ * 0.0;
                auVar64._20_4_ = fVar81;
                fVar82 = auVar97._24_4_ * 0.0;
                auVar64._24_4_ = fVar82;
                auVar64._28_4_ = auVar97._28_4_;
                auVar163._8_4_ = 0x3f800000;
                auVar163._0_8_ = 0x3f8000003f800000;
                auVar163._12_4_ = 0x3f800000;
                auVar163._16_4_ = 0x3f800000;
                auVar163._20_4_ = 0x3f800000;
                auVar163._24_4_ = 0x3f800000;
                auVar163._28_4_ = 0x3f800000;
                auVar93 = vsubps_avx(auVar163,auVar64);
                local_2c0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar68 & 1) * auVar93._0_4_);
                bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar17 * (int)fVar174 | (uint)!bVar17 * auVar93._4_4_);
                bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar17 * (int)fVar175 | (uint)!bVar17 * auVar93._8_4_);
                bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar17 * (int)fVar176 | (uint)!bVar17 * auVar93._12_4_);
                bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar17 * (int)fVar164 | (uint)!bVar17 * auVar93._16_4_);
                bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar17 * (int)fVar81 | (uint)!bVar17 * auVar93._20_4_);
                bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar17 * (int)fVar82 | (uint)!bVar17 * auVar93._24_4_);
                bVar17 = SUB81(uVar69 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar93._28_4_);
                auVar93 = vsubps_avx(auVar98,auVar89);
                auVar83 = vfmadd213ps_fma(auVar93,local_2c0,auVar89);
                uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar30._4_4_ = uVar134;
                auVar30._0_4_ = uVar134;
                auVar30._8_4_ = uVar134;
                auVar30._12_4_ = uVar134;
                auVar30._16_4_ = uVar134;
                auVar30._20_4_ = uVar134;
                auVar30._24_4_ = uVar134;
                auVar30._28_4_ = uVar134;
                auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                             CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                      CONCAT44(auVar83._4_4_ +
                                                                               auVar83._4_4_,
                                                                               auVar83._0_4_ +
                                                                               auVar83._0_4_)))),
                                          auVar30);
                uVar80 = vcmpps_avx512vl(local_280,auVar93,6);
                uVar79 = uVar79 & uVar80;
                bVar78 = (byte)uVar79;
                if (bVar78 != 0) {
                  auVar153._0_4_ = auVar99._0_4_ * fVar154;
                  auVar153._4_4_ = auVar99._4_4_ * fVar133;
                  auVar153._8_4_ = auVar99._8_4_ * fVar149;
                  auVar153._12_4_ = auVar99._12_4_ * fVar150;
                  auVar153._16_4_ = auVar99._16_4_ * 0.0;
                  auVar153._20_4_ = auVar99._20_4_ * 0.0;
                  auVar153._24_4_ = auVar99._24_4_ * 0.0;
                  auVar153._28_4_ = 0;
                  auVar173._8_4_ = 0x3f800000;
                  auVar173._0_8_ = 0x3f8000003f800000;
                  auVar173._12_4_ = 0x3f800000;
                  auVar173._16_4_ = 0x3f800000;
                  auVar173._20_4_ = 0x3f800000;
                  auVar173._24_4_ = 0x3f800000;
                  auVar173._28_4_ = 0x3f800000;
                  auVar93 = vsubps_avx(auVar173,auVar153);
                  auVar123._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar153._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar93._0_4_;
                  bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar123._4_4_ =
                       (uint)bVar17 * (int)auVar153._4_4_ | (uint)!bVar17 * auVar93._4_4_;
                  bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar123._8_4_ =
                       (uint)bVar17 * (int)auVar153._8_4_ | (uint)!bVar17 * auVar93._8_4_;
                  bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar123._12_4_ =
                       (uint)bVar17 * (int)auVar153._12_4_ | (uint)!bVar17 * auVar93._12_4_;
                  bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar123._16_4_ =
                       (uint)bVar17 * (int)auVar153._16_4_ | (uint)!bVar17 * auVar93._16_4_;
                  bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar123._20_4_ =
                       (uint)bVar17 * (int)auVar153._20_4_ | (uint)!bVar17 * auVar93._20_4_;
                  bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar123._24_4_ =
                       (uint)bVar17 * (int)auVar153._24_4_ | (uint)!bVar17 * auVar93._24_4_;
                  auVar123._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar93._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar123,auVar173,auVar31);
                  local_260 = (int)lVar75;
                  local_25c = iVar14;
                  local_250 = local_5b0._0_8_;
                  uStack_248 = local_5b0._8_8_;
                  local_240 = local_5a0._0_8_;
                  uStack_238 = local_5a0._8_8_;
                  local_230 = local_5d0._0_8_;
                  uStack_228 = local_5d0._8_8_;
                  local_220 = local_5c0;
                  uStack_218 = uStack_5b8;
                  pGVar76 = (context->scene->geometries).items[uVar77].ptr;
                  if ((pGVar76->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar83 = vcvtsi2ss_avx512f(auVar86,(int)lVar75);
                    fVar154 = auVar83._0_4_;
                    local_200[0] = (fVar154 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar154 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar154 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar154 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar154 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar154 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar154 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar154 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar144._8_4_ = 0x7f800000;
                    auVar144._0_8_ = 0x7f8000007f800000;
                    auVar144._12_4_ = 0x7f800000;
                    auVar144._16_4_ = 0x7f800000;
                    auVar144._20_4_ = 0x7f800000;
                    auVar144._24_4_ = 0x7f800000;
                    auVar144._28_4_ = 0x7f800000;
                    auVar93 = vblendmps_avx512vl(auVar144,local_280);
                    auVar124._0_4_ =
                         (uint)(bVar78 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000
                    ;
                    bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
                    auVar124._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                    auVar124._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
                    auVar124._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar79 >> 4) & 1);
                    auVar124._16_4_ = (uint)bVar17 * auVar93._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                    auVar124._20_4_ = (uint)bVar17 * auVar93._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
                    auVar124._24_4_ = (uint)bVar17 * auVar93._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar79 >> 7,0);
                    auVar124._28_4_ = (uint)bVar17 * auVar93._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar93 = vshufps_avx(auVar124,auVar124,0xb1);
                    auVar93 = vminps_avx(auVar124,auVar93);
                    auVar91 = vshufpd_avx(auVar93,auVar93,5);
                    auVar93 = vminps_avx(auVar93,auVar91);
                    auVar91 = vpermpd_avx2(auVar93,0x4e);
                    auVar93 = vminps_avx(auVar93,auVar91);
                    uVar23 = vcmpps_avx512vl(auVar124,auVar93,0);
                    uVar71 = (uint)uVar79;
                    if (((byte)uVar23 & bVar78) != 0) {
                      uVar71 = (uint)((byte)uVar23 & bVar78);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar69 = (ulong)uVar72;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar205._0_32_);
                      local_540._0_8_ = pGVar76;
                      local_4c0 = local_280;
                      do {
                        local_420 = local_200[uVar69];
                        local_410 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar69 * 4);
                        local_590.context = context->user;
                        fVar133 = 1.0 - local_420;
                        fVar154 = fVar133 * fVar133 * -3.0;
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),
                                                  ZEXT416((uint)(local_420 * fVar133)),
                                                  ZEXT416(0xc0000000));
                        auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar133)),
                                                  ZEXT416((uint)(local_420 * local_420)),
                                                  ZEXT416(0x40000000));
                        fVar133 = auVar83._0_4_ * 3.0;
                        fVar149 = auVar84._0_4_ * 3.0;
                        fVar150 = local_420 * local_420 * 3.0;
                        auVar184._0_4_ = fVar150 * (float)local_5c0._0_4_;
                        auVar184._4_4_ = fVar150 * (float)local_5c0._4_4_;
                        auVar184._8_4_ = fVar150 * (float)uStack_5b8;
                        auVar184._12_4_ = fVar150 * uStack_5b8._4_4_;
                        auVar186 = ZEXT1664(auVar184);
                        auVar135._4_4_ = fVar149;
                        auVar135._0_4_ = fVar149;
                        auVar135._8_4_ = fVar149;
                        auVar135._12_4_ = fVar149;
                        auVar83 = vfmadd132ps_fma(auVar135,auVar184,local_5d0);
                        auVar168._4_4_ = fVar133;
                        auVar168._0_4_ = fVar133;
                        auVar168._8_4_ = fVar133;
                        auVar168._12_4_ = fVar133;
                        auVar83 = vfmadd132ps_fma(auVar168,auVar83,local_5a0);
                        auVar136._4_4_ = fVar154;
                        auVar136._0_4_ = fVar154;
                        auVar136._8_4_ = fVar154;
                        auVar136._12_4_ = fVar154;
                        auVar83 = vfmadd132ps_fma(auVar136,auVar83,local_5b0);
                        local_450 = auVar83._0_4_;
                        local_440 = vshufps_avx(auVar83,auVar83,0x55);
                        auVar181 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar83,auVar83,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_550._0_8_;
                        uStack_3f8 = local_550._8_8_;
                        local_3f0 = local_560;
                        vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                        uStack_3dc = (local_590.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_590.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_5e0 = local_4f0;
                        local_590.valid = (int *)local_5e0;
                        local_590.geometryUserPtr = pGVar76->userPtr;
                        local_590.hit = (RTCHitN *)&local_450;
                        local_590.N = 4;
                        local_520 = auVar206._0_32_;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar181 = ZEXT1664(local_440);
                          auVar186 = ZEXT1664(auVar184);
                          (*pGVar76->intersectionFilterN)(&local_590);
                          auVar190 = ZEXT3264(local_4c0);
                          auVar206 = ZEXT3264(local_520);
                          pGVar76 = (Geometry *)local_540._0_8_;
                        }
                        uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                        if ((uVar80 & 0xf) == 0) {
LAB_01cef6cc:
                          *(int *)(ray + k * 4 + 0x80) = auVar206._0_4_;
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar181 = ZEXT1664(auVar181._0_16_);
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            (*p_Var16)(&local_590);
                            auVar190 = ZEXT3264(local_4c0);
                            auVar206 = ZEXT3264(local_520);
                            pGVar76 = (Geometry *)local_540._0_8_;
                          }
                          uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                          uVar80 = uVar80 & 0xf;
                          bVar78 = (byte)uVar80;
                          if (bVar78 == 0) goto LAB_01cef6cc;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar66 = *(int *)(local_590.hit + 0xc);
                          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar19 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar78 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar66 = *(int *)(local_590.hit + 0x1c);
                          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar19 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar66 = *(int *)(local_590.hit + 0x2c);
                          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar19 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar66 = *(int *)(local_590.hit + 0x3c);
                          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar19 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar66 = *(int *)(local_590.hit + 0x4c);
                          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar19 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar78 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar17 * iVar1 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar18 * iVar2 |
                               (uint)!bVar18 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0x10c);
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar83;
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar83;
                          auVar206 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar78 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar79;
                        uVar134 = auVar206._0_4_;
                        auVar145._4_4_ = uVar134;
                        auVar145._0_4_ = uVar134;
                        auVar145._8_4_ = uVar134;
                        auVar145._12_4_ = uVar134;
                        auVar145._16_4_ = uVar134;
                        auVar145._20_4_ = uVar134;
                        auVar145._24_4_ = uVar134;
                        auVar145._28_4_ = uVar134;
                        uVar23 = vcmpps_avx512vl(auVar190._0_32_,auVar145,2);
                        if ((bVar78 & (byte)uVar23) == 0) goto LAB_01cef760;
                        bVar78 = bVar78 & (byte)uVar23;
                        uVar79 = (ulong)bVar78;
                        auVar146._8_4_ = 0x7f800000;
                        auVar146._0_8_ = 0x7f8000007f800000;
                        auVar146._12_4_ = 0x7f800000;
                        auVar146._16_4_ = 0x7f800000;
                        auVar146._20_4_ = 0x7f800000;
                        auVar146._24_4_ = 0x7f800000;
                        auVar146._28_4_ = 0x7f800000;
                        auVar93 = vblendmps_avx512vl(auVar146,auVar190._0_32_);
                        auVar125._0_4_ =
                             (uint)(bVar78 & 1) * auVar93._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar78 >> 1 & 1);
                        auVar125._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar78 >> 2 & 1);
                        auVar125._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar78 >> 3 & 1);
                        auVar125._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        bVar17 = (bool)(bVar78 >> 4 & 1);
                        auVar125._16_4_ = (uint)bVar17 * auVar93._16_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        bVar17 = (bool)(bVar78 >> 5 & 1);
                        auVar125._20_4_ = (uint)bVar17 * auVar93._20_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        bVar17 = (bool)(bVar78 >> 6 & 1);
                        auVar125._24_4_ = (uint)bVar17 * auVar93._24_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        auVar125._28_4_ =
                             (uint)(bVar78 >> 7) * auVar93._28_4_ |
                             (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                        auVar93 = vshufps_avx(auVar125,auVar125,0xb1);
                        auVar93 = vminps_avx(auVar125,auVar93);
                        auVar91 = vshufpd_avx(auVar93,auVar93,5);
                        auVar93 = vminps_avx(auVar93,auVar91);
                        auVar91 = vpermpd_avx2(auVar93,0x4e);
                        auVar93 = vminps_avx(auVar93,auVar91);
                        uVar23 = vcmpps_avx512vl(auVar125,auVar93,0);
                        bVar68 = (byte)uVar23 & bVar78;
                        if (bVar68 != 0) {
                          bVar78 = bVar68;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar78; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar69 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar154 = local_200[uVar69];
                    uVar134 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                    fVar149 = 1.0 - fVar154;
                    fVar133 = fVar149 * fVar149 * -3.0;
                    auVar181 = ZEXT464((uint)fVar133);
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                              ZEXT416((uint)(fVar154 * fVar149)),ZEXT416(0xc0000000)
                                             );
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar154 * fVar149)),
                                              ZEXT416((uint)(fVar154 * fVar154)),ZEXT416(0x40000000)
                                             );
                    fVar149 = auVar83._0_4_ * 3.0;
                    fVar150 = auVar84._0_4_ * 3.0;
                    fVar165 = fVar154 * fVar154 * 3.0;
                    auVar183._0_4_ = fVar165 * (float)local_5c0._0_4_;
                    auVar183._4_4_ = fVar165 * (float)local_5c0._4_4_;
                    auVar183._8_4_ = fVar165 * (float)uStack_5b8;
                    auVar183._12_4_ = fVar165 * uStack_5b8._4_4_;
                    auVar186 = ZEXT1664(auVar183);
                    auVar159._4_4_ = fVar150;
                    auVar159._0_4_ = fVar150;
                    auVar159._8_4_ = fVar150;
                    auVar159._12_4_ = fVar150;
                    auVar83 = vfmadd132ps_fma(auVar159,auVar183,local_5d0);
                    auVar167._4_4_ = fVar149;
                    auVar167._0_4_ = fVar149;
                    auVar167._8_4_ = fVar149;
                    auVar167._12_4_ = fVar149;
                    auVar83 = vfmadd132ps_fma(auVar167,auVar83,local_5a0);
                    auVar160._4_4_ = fVar133;
                    auVar160._0_4_ = fVar133;
                    auVar160._8_4_ = fVar133;
                    auVar160._12_4_ = fVar133;
                    auVar83 = vfmadd132ps_fma(auVar160,auVar83,local_5b0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar69 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                    uVar15 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                    uVar15 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                    *(float *)(ray + k * 4 + 0xf0) = fVar154;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar134;
                    *(uint *)(ray + k * 4 + 0x110) = uVar13;
                    *(uint *)(ray + k * 4 + 0x120) = uVar77;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01cef3c4;
      }
LAB_01ceea63:
      uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar28._4_4_ = uVar134;
      auVar28._0_4_ = uVar134;
      auVar28._8_4_ = uVar134;
      auVar28._12_4_ = uVar134;
      auVar28._16_4_ = uVar134;
      auVar28._20_4_ = uVar134;
      auVar28._24_4_ = uVar134;
      auVar28._28_4_ = uVar134;
      uVar23 = vcmpps_avx512vl(local_80,auVar28,2);
      uVar77 = (uint)uVar74 & (uint)uVar74 + 0xff & (uint)uVar23;
      uVar74 = (ulong)uVar77;
    } while (uVar77 != 0);
  }
  return;
LAB_01cef760:
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar207 = ZEXT3264(auVar93);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar209 = ZEXT1664(auVar83);
  auVar208 = ZEXT3264(local_4e0);
  auVar93 = vmovdqa64_avx512vl(local_140);
  auVar205 = ZEXT3264(auVar93);
LAB_01cef3c4:
  lVar75 = lVar75 + 8;
  if (iVar14 <= (int)lVar75) goto LAB_01ceea63;
  goto LAB_01ceeb0e;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }